

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined8 in_R10;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  float fVar103;
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined4 uVar109;
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  float fVar124;
  float fVar125;
  undefined1 auVar117 [16];
  float fVar126;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  vint4 ai_2;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar137;
  float fVar142;
  float fVar143;
  vint4 bi;
  float fVar144;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 ai;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  vint4 ai_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  vfloat4 a0_2;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar210;
  float fVar211;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar212;
  float fVar213;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar231;
  float fVar232;
  vfloat4 a0;
  undefined1 auVar227 [16];
  float fVar233;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  vfloat4 a0_1;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_460;
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined8 uStack_260;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar30;
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  
  uVar29 = (ulong)(byte)prim[1];
  fVar103 = *(float *)(prim + uVar29 * 0x19 + 0x12);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar44 = vsubps_avx(auVar44,*(undefined1 (*) [16])(prim + uVar29 * 0x19 + 6));
  auVar70._0_4_ = fVar103 * auVar44._0_4_;
  auVar70._4_4_ = fVar103 * auVar44._4_4_;
  auVar70._8_4_ = fVar103 * auVar44._8_4_;
  auVar70._12_4_ = fVar103 * auVar44._12_4_;
  auVar51._0_4_ = fVar103 * auVar45._0_4_;
  auVar51._4_4_ = fVar103 * auVar45._4_4_;
  auVar51._8_4_ = fVar103 * auVar45._8_4_;
  auVar51._12_4_ = fVar103 * auVar45._12_4_;
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 4 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 5 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 6 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xb + 6)));
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xc + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xd + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x12 + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x13 + 6)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x14 + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar60._4_4_ = auVar51._0_4_;
  auVar60._0_4_ = auVar51._0_4_;
  auVar60._8_4_ = auVar51._0_4_;
  auVar60._12_4_ = auVar51._0_4_;
  auVar49 = vshufps_avx(auVar51,auVar51,0x55);
  auVar47 = vshufps_avx(auVar51,auVar51,0xaa);
  fVar103 = auVar47._0_4_;
  auVar64._0_4_ = fVar103 * auVar41._0_4_;
  fVar212 = auVar47._4_4_;
  auVar64._4_4_ = fVar212 * auVar41._4_4_;
  fVar201 = auVar47._8_4_;
  auVar64._8_4_ = fVar201 * auVar41._8_4_;
  fVar210 = auVar47._12_4_;
  auVar64._12_4_ = fVar210 * auVar41._12_4_;
  auVar57._0_4_ = auVar42._0_4_ * fVar103;
  auVar57._4_4_ = auVar42._4_4_ * fVar212;
  auVar57._8_4_ = auVar42._8_4_ * fVar201;
  auVar57._12_4_ = auVar42._12_4_ * fVar210;
  auVar52._0_4_ = auVar43._0_4_ * fVar103;
  auVar52._4_4_ = auVar43._4_4_ * fVar212;
  auVar52._8_4_ = auVar43._8_4_ * fVar201;
  auVar52._12_4_ = auVar43._12_4_ * fVar210;
  auVar47 = vfmadd231ps_fma(auVar64,auVar49,auVar45);
  auVar48 = vfmadd231ps_fma(auVar57,auVar49,auVar55);
  auVar49 = vfmadd231ps_fma(auVar52,auVar54,auVar49);
  auVar50 = vfmadd231ps_fma(auVar47,auVar60,auVar44);
  auVar48 = vfmadd231ps_fma(auVar48,auVar60,auVar46);
  auVar51 = vfmadd231ps_fma(auVar49,auVar56,auVar60);
  auVar65._4_4_ = auVar70._0_4_;
  auVar65._0_4_ = auVar70._0_4_;
  auVar65._8_4_ = auVar70._0_4_;
  auVar65._12_4_ = auVar70._0_4_;
  auVar49 = vshufps_avx(auVar70,auVar70,0x55);
  auVar47 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar41 = vmulps_avx512vl(auVar47,auVar41);
  auVar61._0_4_ = auVar47._0_4_ * auVar42._0_4_;
  auVar61._4_4_ = auVar47._4_4_ * auVar42._4_4_;
  auVar61._8_4_ = auVar47._8_4_ * auVar42._8_4_;
  auVar61._12_4_ = auVar47._12_4_ * auVar42._12_4_;
  auVar66._0_4_ = auVar47._0_4_ * auVar43._0_4_;
  auVar66._4_4_ = auVar47._4_4_ * auVar43._4_4_;
  auVar66._8_4_ = auVar47._8_4_ * auVar43._8_4_;
  auVar66._12_4_ = auVar47._12_4_ * auVar43._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar45);
  auVar45 = vfmadd231ps_fma(auVar61,auVar49,auVar55);
  auVar41 = vfmadd231ps_fma(auVar66,auVar49,auVar54);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar65,auVar44);
  auVar55 = vfmadd231ps_fma(auVar45,auVar65,auVar46);
  auVar54 = vfmadd231ps_fma(auVar41,auVar65,auVar56);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar246 = ZEXT1664(auVar44);
  auVar69._8_4_ = 0x219392ef;
  auVar69._0_8_ = 0x219392ef219392ef;
  auVar69._12_4_ = 0x219392ef;
  auVar45 = vandps_avx512vl(auVar50,auVar44);
  uVar34 = vcmpps_avx512vl(auVar45,auVar69,1);
  bVar38 = (bool)((byte)uVar34 & 1);
  auVar47._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._0_4_;
  bVar38 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._4_4_;
  bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._8_4_;
  bVar38 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._12_4_;
  auVar45 = vandps_avx512vl(auVar48,auVar44);
  uVar34 = vcmpps_avx512vl(auVar45,auVar69,1);
  bVar38 = (bool)((byte)uVar34 & 1);
  auVar50._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar48._0_4_;
  bVar38 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar48._4_4_;
  bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar48._8_4_;
  bVar38 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar50._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar48._12_4_;
  auVar44 = vandps_avx512vl(auVar51,auVar44);
  uVar34 = vcmpps_avx512vl(auVar44,auVar69,1);
  bVar38 = (bool)((byte)uVar34 & 1);
  auVar48._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._0_4_;
  bVar38 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._4_4_;
  bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._8_4_;
  bVar38 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._12_4_;
  auVar44 = vrcp14ps_avx512vl(auVar47);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar247 = ZEXT1664(auVar45);
  auVar41 = vfnmadd213ps_avx512vl(auVar47,auVar44,auVar45);
  auVar41 = vfmadd132ps_fma(auVar41,auVar44,auVar44);
  auVar44 = vrcp14ps_avx512vl(auVar50);
  auVar46 = vfnmadd213ps_avx512vl(auVar50,auVar44,auVar45);
  auVar42 = vfmadd132ps_fma(auVar46,auVar44,auVar44);
  auVar44 = vrcp14ps_avx512vl(auVar48);
  auVar45 = vfnmadd213ps_avx512vl(auVar48,auVar44,auVar45);
  auVar56 = vfmadd132ps_fma(auVar45,auVar44,auVar44);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar29 * 7 + 6);
  auVar44 = vpmovsxwd_avx(auVar44);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx512vl(auVar44,auVar43);
  auVar145._0_4_ = auVar41._0_4_ * auVar44._0_4_;
  auVar145._4_4_ = auVar41._4_4_ * auVar44._4_4_;
  auVar145._8_4_ = auVar41._8_4_ * auVar44._8_4_;
  auVar145._12_4_ = auVar41._12_4_ * auVar44._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar29 * 9 + 6);
  auVar44 = vpmovsxwd_avx(auVar45);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx512vl(auVar44,auVar43);
  auVar63._0_4_ = auVar41._0_4_ * auVar44._0_4_;
  auVar63._4_4_ = auVar41._4_4_ * auVar44._4_4_;
  auVar63._8_4_ = auVar41._8_4_ * auVar44._8_4_;
  auVar63._12_4_ = auVar41._12_4_ * auVar44._12_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar29 * 0xe + 6);
  auVar44 = vpmovsxwd_avx(auVar41);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar55);
  auVar59._0_4_ = auVar42._0_4_ * auVar44._0_4_;
  auVar59._4_4_ = auVar42._4_4_ * auVar44._4_4_;
  auVar59._8_4_ = auVar42._8_4_ * auVar44._8_4_;
  auVar59._12_4_ = auVar42._12_4_ * auVar44._12_4_;
  auVar41 = vpbroadcastd_avx512vl();
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar44 = vpmovsxwd_avx(auVar46);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vsubps_avx(auVar44,auVar55);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar29 * 0x15 + 6);
  auVar44 = vpmovsxwd_avx(auVar55);
  auVar58._0_4_ = auVar42._0_4_ * auVar45._0_4_;
  auVar58._4_4_ = auVar42._4_4_ * auVar45._4_4_;
  auVar58._8_4_ = auVar42._8_4_ * auVar45._8_4_;
  auVar58._12_4_ = auVar42._12_4_ * auVar45._12_4_;
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar54);
  auVar62._0_4_ = auVar56._0_4_ * auVar44._0_4_;
  auVar62._4_4_ = auVar56._4_4_ * auVar44._4_4_;
  auVar62._8_4_ = auVar56._8_4_ * auVar44._8_4_;
  auVar62._12_4_ = auVar56._12_4_ * auVar44._12_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar29 * 0x17 + 6);
  auVar44 = vpmovsxwd_avx(auVar42);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar44 = vsubps_avx(auVar44,auVar54);
  auVar53._0_4_ = auVar56._0_4_ * auVar44._0_4_;
  auVar53._4_4_ = auVar56._4_4_ * auVar44._4_4_;
  auVar53._8_4_ = auVar56._8_4_ * auVar44._8_4_;
  auVar53._12_4_ = auVar56._12_4_ * auVar44._12_4_;
  auVar44 = vpminsd_avx(auVar145,auVar63);
  auVar45 = vpminsd_avx(auVar59,auVar58);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar45 = vpminsd_avx(auVar62,auVar53);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar56._4_4_ = uVar109;
  auVar56._0_4_ = uVar109;
  auVar56._8_4_ = uVar109;
  auVar56._12_4_ = uVar109;
  auVar45 = vmaxps_avx512vl(auVar45,auVar56);
  auVar44 = vmaxps_avx(auVar44,auVar45);
  auVar54._8_4_ = 0x3f7ffffa;
  auVar54._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar54._12_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar44,auVar54);
  auVar44 = vpmaxsd_avx(auVar145,auVar63);
  auVar45 = vpmaxsd_avx(auVar59,auVar58);
  auVar44 = vminps_avx(auVar44,auVar45);
  auVar45 = vpmaxsd_avx(auVar62,auVar53);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar43._4_4_ = uVar109;
  auVar43._0_4_ = uVar109;
  auVar43._8_4_ = uVar109;
  auVar43._12_4_ = uVar109;
  auVar45 = vminps_avx512vl(auVar45,auVar43);
  auVar44 = vminps_avx(auVar44,auVar45);
  auVar49._8_4_ = 0x3f800003;
  auVar49._0_8_ = 0x3f8000033f800003;
  auVar49._12_4_ = 0x3f800003;
  auVar44 = vmulps_avx512vl(auVar44,auVar49);
  uVar12 = vcmpps_avx512vl(local_400,auVar44,2);
  uVar13 = vpcmpgtd_avx512vl(auVar41,_DAT_01f4ad30);
  uVar34 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)((byte)uVar12 & 0xf & (byte)uVar13));
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar250 = ZEXT1664(auVar44);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar242 = ZEXT1664(auVar44);
  auVar249 = ZEXT464(0x3f800000);
  auVar44 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar248 = ZEXT1664(auVar44);
LAB_01814fe5:
  if (uVar34 == 0) {
    return;
  }
  lVar31 = 0;
  for (uVar29 = uVar34; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar3 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar31 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar3].ptr;
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar44 = *(undefined1 (*) [16])(_Var9 + uVar29 * (long)pvVar8);
  auVar45 = *(undefined1 (*) [16])(_Var9 + (uVar29 + 1) * (long)pvVar8);
  auVar41 = *(undefined1 (*) [16])(_Var9 + (uVar29 + 2) * (long)pvVar8);
  auVar46 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar29 + 3));
  lVar31 = *(long *)&pGVar6[1].time_range.upper;
  auVar55 = *(undefined1 (*) [16])(lVar31 + (long)p_Var7 * uVar29);
  auVar42 = *(undefined1 (*) [16])(lVar31 + (long)p_Var7 * (uVar29 + 1));
  auVar56 = *(undefined1 (*) [16])(lVar31 + (long)p_Var7 * (uVar29 + 2));
  uVar34 = uVar34 - 1 & uVar34;
  auVar54 = *(undefined1 (*) [16])(lVar31 + (long)p_Var7 * (uVar29 + 3));
  if (uVar34 != 0) {
    uVar35 = uVar34 - 1 & uVar34;
    for (uVar29 = uVar34; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    }
    if (uVar35 != 0) {
      for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar103 = *(float *)(ray + k * 4 + 0x60);
  auVar66 = auVar250._0_16_;
  auVar47 = vmulps_avx512vl(auVar54,auVar66);
  auVar110._0_12_ = ZEXT812(0);
  auVar110._12_4_ = 0;
  auVar49 = vfmadd213ps_fma(auVar110,auVar56,auVar47);
  auVar111._0_4_ = auVar42._0_4_ + auVar49._0_4_;
  auVar111._4_4_ = auVar42._4_4_ + auVar49._4_4_;
  auVar111._8_4_ = auVar42._8_4_ + auVar49._8_4_;
  auVar111._12_4_ = auVar42._12_4_ + auVar49._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar111,auVar55,auVar66);
  auVar57 = ZEXT816(0) << 0x40;
  auVar117._0_4_ = auVar54._0_4_ * 0.0;
  auVar117._4_4_ = auVar54._4_4_ * 0.0;
  auVar117._8_4_ = auVar54._8_4_ * 0.0;
  auVar117._12_4_ = auVar54._12_4_ * 0.0;
  auVar58 = auVar242._0_16_;
  auVar49 = vfmadd231ps_avx512vl(auVar117,auVar56,auVar58);
  auVar49 = vfmadd231ps_fma(auVar49,auVar42,auVar57);
  auVar50 = vfnmadd231ps_avx512vl(auVar49,auVar55,auVar58);
  auVar51 = vmulps_avx512vl(auVar46,auVar66);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar51);
  auVar227._0_4_ = auVar49._0_4_ + auVar45._0_4_;
  auVar227._4_4_ = auVar49._4_4_ + auVar45._4_4_;
  auVar227._8_4_ = auVar49._8_4_ + auVar45._8_4_;
  auVar227._12_4_ = auVar49._12_4_ + auVar45._12_4_;
  auVar52 = vfmadd231ps_avx512vl(auVar227,auVar44,auVar66);
  auVar234._0_4_ = auVar46._0_4_ * 0.0;
  auVar234._4_4_ = auVar46._4_4_ * 0.0;
  auVar234._8_4_ = auVar46._8_4_ * 0.0;
  auVar234._12_4_ = auVar46._12_4_ * 0.0;
  auVar49 = vfmadd231ps_avx512vl(auVar234,auVar41,auVar58);
  auVar49 = vfmadd231ps_fma(auVar49,auVar45,auVar57);
  auVar53 = vfnmadd231ps_avx512vl(auVar49,auVar44,auVar58);
  auVar127._0_4_ = auVar56._0_4_ + auVar47._0_4_;
  auVar127._4_4_ = auVar56._4_4_ + auVar47._4_4_;
  auVar127._8_4_ = auVar56._8_4_ + auVar47._8_4_;
  auVar127._12_4_ = auVar56._12_4_ + auVar47._12_4_;
  auVar49 = vfmadd231ps_fma(auVar127,auVar42,auVar57);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar55,auVar66);
  auVar54 = vmulps_avx512vl(auVar54,auVar58);
  auVar56 = vfmadd231ps_fma(auVar54,auVar57,auVar56);
  auVar42 = vfnmadd231ps_avx512vl(auVar56,auVar58,auVar42);
  auVar56 = vfmadd231ps_fma(auVar42,auVar57,auVar55);
  auVar185._0_4_ = auVar51._0_4_ + auVar41._0_4_;
  auVar185._4_4_ = auVar51._4_4_ + auVar41._4_4_;
  auVar185._8_4_ = auVar51._8_4_ + auVar41._8_4_;
  auVar185._12_4_ = auVar51._12_4_ + auVar41._12_4_;
  auVar55 = vfmadd231ps_fma(auVar185,auVar45,auVar57);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar44,auVar66);
  auVar46 = vmulps_avx512vl(auVar46,auVar58);
  auVar41 = vfmadd231ps_fma(auVar46,auVar57,auVar41);
  auVar45 = vfnmadd231ps_avx512vl(auVar41,auVar58,auVar45);
  auVar42 = vfmadd231ps_fma(auVar45,auVar57,auVar44);
  auVar44 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar45 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar116 = auVar50._0_4_;
  auVar155._0_4_ = fVar116 * auVar45._0_4_;
  fVar124 = auVar50._4_4_;
  auVar155._4_4_ = fVar124 * auVar45._4_4_;
  fVar125 = auVar50._8_4_;
  auVar155._8_4_ = fVar125 * auVar45._8_4_;
  fVar126 = auVar50._12_4_;
  auVar155._12_4_ = fVar126 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar155,auVar44,auVar52);
  auVar41 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar156._0_4_ = fVar116 * auVar45._0_4_;
  auVar156._4_4_ = fVar124 * auVar45._4_4_;
  auVar156._8_4_ = fVar125 * auVar45._8_4_;
  auVar156._12_4_ = fVar126 * auVar45._12_4_;
  auVar44 = vfmsub231ps_fma(auVar156,auVar44,auVar53);
  auVar46 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar45 = vshufps_avx(auVar55,auVar55,0xc9);
  fVar137 = auVar56._0_4_;
  auVar146._0_4_ = fVar137 * auVar45._0_4_;
  fVar142 = auVar56._4_4_;
  auVar146._4_4_ = fVar142 * auVar45._4_4_;
  fVar143 = auVar56._8_4_;
  auVar146._8_4_ = fVar143 * auVar45._8_4_;
  fVar144 = auVar56._12_4_;
  auVar146._12_4_ = fVar144 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar146,auVar44,auVar55);
  auVar55 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar186._0_4_ = auVar45._0_4_ * fVar137;
  auVar186._4_4_ = auVar45._4_4_ * fVar142;
  auVar186._8_4_ = auVar45._8_4_ * fVar143;
  auVar186._12_4_ = auVar45._12_4_ * fVar144;
  auVar45 = vfmsub231ps_fma(auVar186,auVar44,auVar42);
  auVar44 = vdpps_avx(auVar41,auVar41,0x7f);
  auVar42 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar201 = auVar44._0_4_;
  auVar187._4_12_ = ZEXT812(0) << 0x20;
  auVar187._0_4_ = fVar201;
  auVar45 = vrsqrt14ss_avx512f(auVar57,auVar187);
  auVar54 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  fVar212 = auVar45._0_4_;
  auVar45 = vdpps_avx(auVar41,auVar46,0x7f);
  fVar212 = auVar54._0_4_ + auVar47._0_4_ * fVar212 * fVar212 * fVar212;
  fVar213 = fVar212 * auVar41._0_4_;
  fVar223 = fVar212 * auVar41._4_4_;
  fVar224 = fVar212 * auVar41._8_4_;
  fVar225 = fVar212 * auVar41._12_4_;
  auVar196._0_4_ = auVar46._0_4_ * fVar201;
  auVar196._4_4_ = auVar46._4_4_ * fVar201;
  auVar196._8_4_ = auVar46._8_4_ * fVar201;
  auVar196._12_4_ = auVar46._12_4_ * fVar201;
  fVar201 = auVar45._0_4_;
  auVar167._0_4_ = fVar201 * auVar41._0_4_;
  auVar167._4_4_ = fVar201 * auVar41._4_4_;
  auVar167._8_4_ = fVar201 * auVar41._8_4_;
  auVar167._12_4_ = fVar201 * auVar41._12_4_;
  auVar41 = vsubps_avx(auVar196,auVar167);
  auVar45 = vrcp14ss_avx512f(auVar57,auVar187);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar45,ZEXT416(0x40000000));
  fVar210 = auVar45._0_4_ * auVar44._0_4_;
  auVar44 = vdpps_avx(auVar55,auVar55,0x7f);
  fVar211 = auVar44._0_4_;
  auVar188._4_12_ = ZEXT812(0) << 0x20;
  auVar188._0_4_ = fVar211;
  auVar45 = vrsqrt14ss_avx512f(auVar57,auVar188);
  auVar46 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
  fVar201 = auVar45._0_4_;
  fVar201 = auVar46._0_4_ + auVar54._0_4_ * fVar201 * fVar201 * fVar201;
  auVar45 = vdpps_avx(auVar55,auVar42,0x7f);
  fVar226 = fVar201 * auVar55._0_4_;
  fVar231 = fVar201 * auVar55._4_4_;
  fVar232 = fVar201 * auVar55._8_4_;
  fVar233 = fVar201 * auVar55._12_4_;
  auVar157._0_4_ = fVar211 * auVar42._0_4_;
  auVar157._4_4_ = fVar211 * auVar42._4_4_;
  auVar157._8_4_ = fVar211 * auVar42._8_4_;
  auVar157._12_4_ = fVar211 * auVar42._12_4_;
  fVar211 = auVar45._0_4_;
  auVar147._0_4_ = fVar211 * auVar55._0_4_;
  auVar147._4_4_ = fVar211 * auVar55._4_4_;
  auVar147._8_4_ = fVar211 * auVar55._8_4_;
  auVar147._12_4_ = fVar211 * auVar55._12_4_;
  auVar46 = vsubps_avx(auVar157,auVar147);
  auVar45 = vrcp14ss_avx512f(auVar57,auVar188);
  auVar44 = vfnmadd213ss_avx512f(auVar44,auVar45,ZEXT416(0x40000000));
  fVar211 = auVar44._0_4_ * auVar45._0_4_;
  auVar44 = vshufps_avx(auVar48,auVar48,0xff);
  auVar173._0_4_ = fVar213 * auVar44._0_4_;
  auVar173._4_4_ = fVar223 * auVar44._4_4_;
  auVar173._8_4_ = fVar224 * auVar44._8_4_;
  auVar173._12_4_ = fVar225 * auVar44._12_4_;
  local_340 = vsubps_avx(auVar48,auVar173);
  auVar45 = vshufps_avx(auVar50,auVar50,0xff);
  auVar158._0_4_ = auVar45._0_4_ * fVar213 + auVar44._0_4_ * fVar212 * fVar210 * auVar41._0_4_;
  auVar158._4_4_ = auVar45._4_4_ * fVar223 + auVar44._4_4_ * fVar212 * fVar210 * auVar41._4_4_;
  auVar158._8_4_ = auVar45._8_4_ * fVar224 + auVar44._8_4_ * fVar212 * fVar210 * auVar41._8_4_;
  auVar158._12_4_ = auVar45._12_4_ * fVar225 + auVar44._12_4_ * fVar212 * fVar210 * auVar41._12_4_;
  auVar41 = vsubps_avx(auVar50,auVar158);
  local_350._0_4_ = auVar173._0_4_ + auVar48._0_4_;
  local_350._4_4_ = auVar173._4_4_ + auVar48._4_4_;
  fStack_348 = auVar173._8_4_ + auVar48._8_4_;
  fStack_344 = auVar173._12_4_ + auVar48._12_4_;
  auVar44 = vshufps_avx(auVar49,auVar49,0xff);
  auVar159._0_4_ = fVar226 * auVar44._0_4_;
  auVar159._4_4_ = fVar231 * auVar44._4_4_;
  auVar159._8_4_ = fVar232 * auVar44._8_4_;
  auVar159._12_4_ = fVar233 * auVar44._12_4_;
  local_360 = vsubps_avx512vl(auVar49,auVar159);
  auVar45 = vshufps_avx(auVar56,auVar56,0xff);
  auVar118._0_4_ = auVar45._0_4_ * fVar226 + auVar44._0_4_ * fVar201 * auVar46._0_4_ * fVar211;
  auVar118._4_4_ = auVar45._4_4_ * fVar231 + auVar44._4_4_ * fVar201 * auVar46._4_4_ * fVar211;
  auVar118._8_4_ = auVar45._8_4_ * fVar232 + auVar44._8_4_ * fVar201 * auVar46._8_4_ * fVar211;
  auVar118._12_4_ = auVar45._12_4_ * fVar233 + auVar44._12_4_ * fVar201 * auVar46._12_4_ * fVar211;
  auVar44 = vsubps_avx(auVar56,auVar118);
  local_370._0_4_ = auVar49._0_4_ + auVar159._0_4_;
  local_370._4_4_ = auVar49._4_4_ + auVar159._4_4_;
  fStack_368 = auVar49._8_4_ + auVar159._8_4_;
  fStack_364 = auVar49._12_4_ + auVar159._12_4_;
  auVar128._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar128._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar128._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar128._12_4_ = auVar41._12_4_ * 0.33333334;
  local_380 = vaddps_avx512vl(local_340,auVar128);
  auVar129._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar129._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar129._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar129._12_4_ = auVar44._12_4_ * 0.33333334;
  local_390 = vsubps_avx512vl(local_360,auVar129);
  auVar112._0_4_ = (fVar116 + auVar158._0_4_) * 0.33333334;
  auVar112._4_4_ = (fVar124 + auVar158._4_4_) * 0.33333334;
  auVar112._8_4_ = (fVar125 + auVar158._8_4_) * 0.33333334;
  auVar112._12_4_ = (fVar126 + auVar158._12_4_) * 0.33333334;
  _local_3a0 = vaddps_avx512vl(_local_350,auVar112);
  auVar113._0_4_ = (fVar137 + auVar118._0_4_) * 0.33333334;
  auVar113._4_4_ = (fVar142 + auVar118._4_4_) * 0.33333334;
  auVar113._8_4_ = (fVar143 + auVar118._8_4_) * 0.33333334;
  auVar113._12_4_ = (fVar144 + auVar118._12_4_) * 0.33333334;
  _local_3b0 = vsubps_avx512vl(_local_370,auVar113);
  local_2c0 = vsubps_avx(local_340,auVar43);
  uVar109 = local_2c0._0_4_;
  auVar119._4_4_ = uVar109;
  auVar119._0_4_ = uVar109;
  auVar119._8_4_ = uVar109;
  auVar119._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_2c0,local_2c0,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar45 = vshufps_avx(local_2c0,local_2c0,0xaa);
  fVar212 = pre->ray_space[k].vz.field_0.m128[0];
  fVar201 = pre->ray_space[k].vz.field_0.m128[1];
  fVar210 = pre->ray_space[k].vz.field_0.m128[2];
  fVar211 = pre->ray_space[k].vz.field_0.m128[3];
  auVar114._0_4_ = fVar212 * auVar45._0_4_;
  auVar114._4_4_ = fVar201 * auVar45._4_4_;
  auVar114._8_4_ = fVar210 * auVar45._8_4_;
  auVar114._12_4_ = fVar211 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar2,auVar44);
  auVar56 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar1,auVar119);
  local_2d0 = vsubps_avx512vl(local_380,auVar43);
  uVar109 = local_2d0._0_4_;
  auVar130._4_4_ = uVar109;
  auVar130._0_4_ = uVar109;
  auVar130._8_4_ = uVar109;
  auVar130._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar45 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar120._0_4_ = fVar212 * auVar45._0_4_;
  auVar120._4_4_ = fVar201 * auVar45._4_4_;
  auVar120._8_4_ = fVar210 * auVar45._8_4_;
  auVar120._12_4_ = fVar211 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar2,auVar44);
  auVar54 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar1,auVar130);
  local_2e0 = vsubps_avx512vl(local_390,auVar43);
  uVar109 = local_2e0._0_4_;
  auVar160._4_4_ = uVar109;
  auVar160._0_4_ = uVar109;
  auVar160._8_4_ = uVar109;
  auVar160._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar45 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar131._0_4_ = fVar212 * auVar45._0_4_;
  auVar131._4_4_ = fVar201 * auVar45._4_4_;
  auVar131._8_4_ = fVar210 * auVar45._8_4_;
  auVar131._12_4_ = fVar211 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar2,auVar44);
  auVar49 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar1,auVar160);
  local_2f0 = vsubps_avx512vl(local_360,auVar43);
  uVar109 = local_2f0._0_4_;
  auVar174._4_4_ = uVar109;
  auVar174._0_4_ = uVar109;
  auVar174._8_4_ = uVar109;
  auVar174._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar45 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar161._0_4_ = fVar212 * auVar45._0_4_;
  auVar161._4_4_ = fVar201 * auVar45._4_4_;
  auVar161._8_4_ = fVar210 * auVar45._8_4_;
  auVar161._12_4_ = fVar211 * auVar45._12_4_;
  auVar44 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar2,auVar44);
  auVar47 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar1,auVar174);
  local_300 = vsubps_avx(_local_350,auVar43);
  uVar109 = local_300._0_4_;
  auVar175._4_4_ = uVar109;
  auVar175._0_4_ = uVar109;
  auVar175._8_4_ = uVar109;
  auVar175._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_300,local_300,0x55);
  auVar45 = vshufps_avx(local_300,local_300,0xaa);
  auVar197._0_4_ = auVar45._0_4_ * fVar212;
  auVar197._4_4_ = auVar45._4_4_ * fVar201;
  auVar197._8_4_ = auVar45._8_4_ * fVar210;
  auVar197._12_4_ = auVar45._12_4_ * fVar211;
  auVar44 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar2,auVar44);
  auVar48 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar1,auVar175);
  local_310 = vsubps_avx512vl(_local_3a0,auVar43);
  uVar109 = local_310._0_4_;
  auVar176._4_4_ = uVar109;
  auVar176._0_4_ = uVar109;
  auVar176._8_4_ = uVar109;
  auVar176._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_310,local_310,0x55);
  auVar45 = vshufps_avx(local_310,local_310,0xaa);
  auVar202._0_4_ = auVar45._0_4_ * fVar212;
  auVar202._4_4_ = auVar45._4_4_ * fVar201;
  auVar202._8_4_ = auVar45._8_4_ * fVar210;
  auVar202._12_4_ = auVar45._12_4_ * fVar211;
  auVar44 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar2,auVar44);
  auVar50 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar1,auVar176);
  local_320 = vsubps_avx512vl(_local_3b0,auVar43);
  uVar109 = local_320._0_4_;
  auVar177._4_4_ = uVar109;
  auVar177._0_4_ = uVar109;
  auVar177._8_4_ = uVar109;
  auVar177._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_320,local_320,0x55);
  auVar45 = vshufps_avx(local_320,local_320,0xaa);
  auVar214._0_4_ = auVar45._0_4_ * fVar212;
  auVar214._4_4_ = auVar45._4_4_ * fVar201;
  auVar214._8_4_ = auVar45._8_4_ * fVar210;
  auVar214._12_4_ = auVar45._12_4_ * fVar211;
  auVar44 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar2,auVar44);
  auVar51 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar1,auVar177);
  local_330 = vsubps_avx(_local_370,auVar43);
  uVar109 = local_330._0_4_;
  auVar68._4_4_ = uVar109;
  auVar68._0_4_ = uVar109;
  auVar68._8_4_ = uVar109;
  auVar68._12_4_ = uVar109;
  auVar44 = vshufps_avx(local_330,local_330,0x55);
  auVar45 = vshufps_avx(local_330,local_330,0xaa);
  auVar168._0_4_ = auVar45._0_4_ * fVar212;
  auVar168._4_4_ = auVar45._4_4_ * fVar201;
  auVar168._8_4_ = auVar45._8_4_ * fVar210;
  auVar168._12_4_ = auVar45._12_4_ * fVar211;
  auVar44 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar2,auVar44);
  auVar43 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar1,auVar68);
  auVar41 = vmovlhps_avx(auVar56,auVar48);
  auVar46 = vmovlhps_avx(auVar54,auVar50);
  auVar42 = vmovlhps_avx512f(auVar49,auVar51);
  _local_2a0 = vmovlhps_avx512f(auVar47,auVar43);
  auVar45 = vminps_avx(auVar41,auVar46);
  auVar44 = vmaxps_avx(auVar41,auVar46);
  auVar55 = vminps_avx512vl(auVar42,_local_2a0);
  auVar45 = vminps_avx(auVar45,auVar55);
  auVar55 = vmaxps_avx512vl(auVar42,_local_2a0);
  auVar44 = vmaxps_avx(auVar44,auVar55);
  auVar55 = vshufpd_avx(auVar45,auVar45,3);
  auVar45 = vminps_avx(auVar45,auVar55);
  auVar55 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vmaxps_avx(auVar44,auVar55);
  auVar45 = vandps_avx512vl(auVar45,auVar246._0_16_);
  auVar44 = vandps_avx512vl(auVar44,auVar246._0_16_);
  auVar44 = vmaxps_avx(auVar45,auVar44);
  auVar45 = vmovshdup_avx(auVar44);
  auVar44 = vmaxss_avx(auVar45,auVar44);
  fVar212 = auVar44._0_4_ * 9.536743e-07;
  auVar45 = vmovddup_avx512vl(auVar56);
  auVar55 = vmovddup_avx512vl(auVar54);
  auVar56 = vmovddup_avx512vl(auVar49);
  auVar54 = vmovddup_avx512vl(auVar47);
  local_2b0 = ZEXT416((uint)fVar212);
  auVar104._4_4_ = fVar212;
  auVar104._0_4_ = fVar212;
  auVar104._8_4_ = fVar212;
  auVar104._12_4_ = fVar212;
  local_1c0._16_4_ = fVar212;
  local_1c0._0_16_ = auVar104;
  local_1c0._20_4_ = fVar212;
  local_1c0._24_4_ = fVar212;
  local_1c0._28_4_ = fVar212;
  auVar44 = vxorps_avx512vl(auVar104,auVar66);
  local_1e0 = auVar44._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  uVar29 = 0;
  local_270 = vsubps_avx(auVar46,auVar41);
  local_280 = vsubps_avx512vl(auVar42,auVar46);
  local_290 = vsubps_avx512vl(_local_2a0,auVar42);
  local_3c0 = vsubps_avx(_local_350,local_340);
  local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  _local_3f0 = vsubps_avx512vl(_local_370,local_360);
  local_200 = vpbroadcastd_avx512vl();
  local_220 = vpbroadcastd_avx512vl();
  auVar44 = ZEXT816(0x3f80000000000000);
  auVar67 = auVar44;
LAB_01815746:
  do {
    auVar49 = vshufps_avx(auVar67,auVar67,0x50);
    auVar235._8_4_ = 0x3f800000;
    auVar235._0_8_ = 0x3f8000003f800000;
    auVar235._12_4_ = 0x3f800000;
    auVar91._16_4_ = 0x3f800000;
    auVar91._0_16_ = auVar235;
    auVar91._20_4_ = 0x3f800000;
    auVar91._24_4_ = 0x3f800000;
    auVar91._28_4_ = 0x3f800000;
    auVar47 = vsubps_avx(auVar235,auVar49);
    fVar212 = auVar49._0_4_;
    fVar116 = auVar48._0_4_;
    auVar138._0_4_ = fVar116 * fVar212;
    fVar201 = auVar49._4_4_;
    fVar124 = auVar48._4_4_;
    auVar138._4_4_ = fVar124 * fVar201;
    fVar210 = auVar49._8_4_;
    auVar138._8_4_ = fVar116 * fVar210;
    fVar211 = auVar49._12_4_;
    auVar138._12_4_ = fVar124 * fVar211;
    fVar125 = auVar50._0_4_;
    auVar148._0_4_ = fVar125 * fVar212;
    fVar126 = auVar50._4_4_;
    auVar148._4_4_ = fVar126 * fVar201;
    auVar148._8_4_ = fVar125 * fVar210;
    auVar148._12_4_ = fVar126 * fVar211;
    fVar137 = auVar51._0_4_;
    auVar162._0_4_ = fVar137 * fVar212;
    fVar142 = auVar51._4_4_;
    auVar162._4_4_ = fVar142 * fVar201;
    auVar162._8_4_ = fVar137 * fVar210;
    auVar162._12_4_ = fVar142 * fVar211;
    fVar143 = auVar43._0_4_;
    auVar121._0_4_ = fVar143 * fVar212;
    fVar144 = auVar43._4_4_;
    auVar121._4_4_ = fVar144 * fVar201;
    auVar121._8_4_ = fVar143 * fVar210;
    auVar121._12_4_ = fVar144 * fVar211;
    auVar52 = vfmadd231ps_avx512vl(auVar138,auVar47,auVar45);
    auVar53 = vfmadd231ps_avx512vl(auVar148,auVar47,auVar55);
    auVar57 = vfmadd231ps_avx512vl(auVar162,auVar47,auVar56);
    auVar47 = vfmadd231ps_avx512vl(auVar121,auVar54,auVar47);
    auVar49 = vmovshdup_avx(auVar44);
    fVar201 = auVar44._0_4_;
    fVar212 = (auVar49._0_4_ - fVar201) * 0.04761905;
    auVar85._4_4_ = fVar201;
    auVar85._0_4_ = fVar201;
    auVar85._8_4_ = fVar201;
    auVar85._12_4_ = fVar201;
    auVar85._16_4_ = fVar201;
    auVar85._20_4_ = fVar201;
    auVar85._24_4_ = fVar201;
    auVar85._28_4_ = fVar201;
    auVar75._0_8_ = auVar49._0_8_;
    auVar75._8_8_ = auVar75._0_8_;
    auVar75._16_8_ = auVar75._0_8_;
    auVar75._24_8_ = auVar75._0_8_;
    auVar88 = vsubps_avx(auVar75,auVar85);
    uVar109 = auVar52._0_4_;
    auVar89._4_4_ = uVar109;
    auVar89._0_4_ = uVar109;
    auVar89._8_4_ = uVar109;
    auVar89._12_4_ = uVar109;
    auVar89._16_4_ = uVar109;
    auVar89._20_4_ = uVar109;
    auVar89._24_4_ = uVar109;
    auVar89._28_4_ = uVar109;
    auVar77._8_4_ = 1;
    auVar77._0_8_ = 0x100000001;
    auVar77._12_4_ = 1;
    auVar77._16_4_ = 1;
    auVar77._20_4_ = 1;
    auVar77._24_4_ = 1;
    auVar77._28_4_ = 1;
    auVar87 = ZEXT1632(auVar52);
    auVar86 = vpermps_avx2(auVar77,auVar87);
    auVar71 = vbroadcastss_avx512vl(auVar53);
    auVar81 = ZEXT1632(auVar53);
    auVar72 = vpermps_avx512vl(auVar77,auVar81);
    auVar73 = vbroadcastss_avx512vl(auVar57);
    auVar82 = ZEXT1632(auVar57);
    auVar74 = vpermps_avx512vl(auVar77,auVar82);
    auVar75 = vbroadcastss_avx512vl(auVar47);
    auVar84 = ZEXT1632(auVar47);
    auVar76 = vpermps_avx512vl(auVar77,auVar84);
    auVar90._4_4_ = fVar212;
    auVar90._0_4_ = fVar212;
    auVar90._8_4_ = fVar212;
    auVar90._12_4_ = fVar212;
    auVar90._16_4_ = fVar212;
    auVar90._20_4_ = fVar212;
    auVar90._24_4_ = fVar212;
    auVar90._28_4_ = fVar212;
    auVar83._8_4_ = 2;
    auVar83._0_8_ = 0x200000002;
    auVar83._12_4_ = 2;
    auVar83._16_4_ = 2;
    auVar83._20_4_ = 2;
    auVar83._24_4_ = 2;
    auVar83._28_4_ = 2;
    auVar77 = vpermps_avx512vl(auVar83,auVar87);
    auVar78 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar79 = vpermps_avx512vl(auVar78,auVar87);
    auVar80 = vpermps_avx512vl(auVar83,auVar81);
    auVar81 = vpermps_avx512vl(auVar78,auVar81);
    auVar87 = vpermps_avx2(auVar83,auVar82);
    auVar82 = vpermps_avx512vl(auVar78,auVar82);
    auVar83 = vpermps_avx512vl(auVar83,auVar84);
    auVar78 = vpermps_avx512vl(auVar78,auVar84);
    auVar49 = vfmadd132ps_fma(auVar88,auVar85,_DAT_01f7b040);
    auVar88 = vsubps_avx(auVar91,ZEXT1632(auVar49));
    auVar84 = vmulps_avx512vl(auVar71,ZEXT1632(auVar49));
    auVar91 = ZEXT1632(auVar49);
    auVar85 = vmulps_avx512vl(auVar72,auVar91);
    auVar47 = vfmadd231ps_fma(auVar84,auVar88,auVar89);
    auVar52 = vfmadd231ps_fma(auVar85,auVar88,auVar86);
    auVar84 = vmulps_avx512vl(auVar73,auVar91);
    auVar85 = vmulps_avx512vl(auVar74,auVar91);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar71);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar72);
    auVar71 = vmulps_avx512vl(auVar75,auVar91);
    auVar89 = ZEXT1632(auVar49);
    auVar72 = vmulps_avx512vl(auVar76,auVar89);
    auVar73 = vfmadd231ps_avx512vl(auVar71,auVar88,auVar73);
    auVar74 = vfmadd231ps_avx512vl(auVar72,auVar88,auVar74);
    fVar210 = auVar49._0_4_;
    fVar211 = auVar49._4_4_;
    auVar71._4_4_ = fVar211 * auVar84._4_4_;
    auVar71._0_4_ = fVar210 * auVar84._0_4_;
    fVar213 = auVar49._8_4_;
    auVar71._8_4_ = fVar213 * auVar84._8_4_;
    fVar223 = auVar49._12_4_;
    auVar71._12_4_ = fVar223 * auVar84._12_4_;
    auVar71._16_4_ = auVar84._16_4_ * 0.0;
    auVar71._20_4_ = auVar84._20_4_ * 0.0;
    auVar71._24_4_ = auVar84._24_4_ * 0.0;
    auVar71._28_4_ = fVar201;
    auVar72._4_4_ = fVar211 * auVar85._4_4_;
    auVar72._0_4_ = fVar210 * auVar85._0_4_;
    auVar72._8_4_ = fVar213 * auVar85._8_4_;
    auVar72._12_4_ = fVar223 * auVar85._12_4_;
    auVar72._16_4_ = auVar85._16_4_ * 0.0;
    auVar72._20_4_ = auVar85._20_4_ * 0.0;
    auVar72._24_4_ = auVar85._24_4_ * 0.0;
    auVar72._28_4_ = auVar86._28_4_;
    auVar47 = vfmadd231ps_fma(auVar71,auVar88,ZEXT1632(auVar47));
    auVar52 = vfmadd231ps_fma(auVar72,auVar88,ZEXT1632(auVar52));
    auVar76._0_4_ = fVar210 * auVar73._0_4_;
    auVar76._4_4_ = fVar211 * auVar73._4_4_;
    auVar76._8_4_ = fVar213 * auVar73._8_4_;
    auVar76._12_4_ = fVar223 * auVar73._12_4_;
    auVar76._16_4_ = auVar73._16_4_ * 0.0;
    auVar76._20_4_ = auVar73._20_4_ * 0.0;
    auVar76._24_4_ = auVar73._24_4_ * 0.0;
    auVar76._28_4_ = 0;
    auVar86._4_4_ = fVar211 * auVar74._4_4_;
    auVar86._0_4_ = fVar210 * auVar74._0_4_;
    auVar86._8_4_ = fVar213 * auVar74._8_4_;
    auVar86._12_4_ = fVar223 * auVar74._12_4_;
    auVar86._16_4_ = auVar74._16_4_ * 0.0;
    auVar86._20_4_ = auVar74._20_4_ * 0.0;
    auVar86._24_4_ = auVar74._24_4_ * 0.0;
    auVar86._28_4_ = auVar73._28_4_;
    auVar53 = vfmadd231ps_fma(auVar76,auVar88,auVar84);
    auVar57 = vfmadd231ps_fma(auVar86,auVar88,auVar85);
    auVar73._28_4_ = auVar85._28_4_;
    auVar73._0_28_ =
         ZEXT1628(CONCAT412(fVar223 * auVar57._12_4_,
                            CONCAT48(fVar213 * auVar57._8_4_,
                                     CONCAT44(fVar211 * auVar57._4_4_,fVar210 * auVar57._0_4_))));
    auVar58 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar223 * auVar53._12_4_,
                                                 CONCAT48(fVar213 * auVar53._8_4_,
                                                          CONCAT44(fVar211 * auVar53._4_4_,
                                                                   fVar210 * auVar53._0_4_)))),
                              auVar88,ZEXT1632(auVar47));
    auVar66 = vfmadd231ps_fma(auVar73,auVar88,ZEXT1632(auVar52));
    auVar86 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar47));
    auVar71 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar52));
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar86 = vmulps_avx512vl(auVar86,auVar72);
    auVar71 = vmulps_avx512vl(auVar71,auVar72);
    auVar84._0_4_ = fVar212 * auVar86._0_4_;
    auVar84._4_4_ = fVar212 * auVar86._4_4_;
    auVar84._8_4_ = fVar212 * auVar86._8_4_;
    auVar84._12_4_ = fVar212 * auVar86._12_4_;
    auVar84._16_4_ = fVar212 * auVar86._16_4_;
    auVar84._20_4_ = fVar212 * auVar86._20_4_;
    auVar84._24_4_ = fVar212 * auVar86._24_4_;
    auVar84._28_4_ = 0;
    auVar86 = vmulps_avx512vl(auVar90,auVar71);
    auVar52 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
    auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar58),_DAT_01fb9fc0,ZEXT1632(auVar52));
    auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_01fb9fc0,ZEXT1632(auVar52));
    auVar123._0_4_ = auVar84._0_4_ + auVar58._0_4_;
    auVar123._4_4_ = auVar84._4_4_ + auVar58._4_4_;
    auVar123._8_4_ = auVar84._8_4_ + auVar58._8_4_;
    auVar123._12_4_ = auVar84._12_4_ + auVar58._12_4_;
    auVar123._16_4_ = auVar84._16_4_ + 0.0;
    auVar123._20_4_ = auVar84._20_4_ + 0.0;
    auVar123._24_4_ = auVar84._24_4_ + 0.0;
    auVar123._28_4_ = 0;
    auVar85 = ZEXT1632(auVar52);
    auVar74 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,auVar85);
    auVar75 = vaddps_avx512vl(ZEXT1632(auVar66),auVar86);
    auVar76 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar85);
    auVar86 = vsubps_avx(auVar71,auVar74);
    auVar76 = vsubps_avx512vl(auVar73,auVar76);
    auVar74 = vmulps_avx512vl(auVar80,auVar89);
    auVar84 = vmulps_avx512vl(auVar81,auVar89);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar88,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar79);
    auVar79 = vmulps_avx512vl(auVar87,auVar89);
    auVar84 = vmulps_avx512vl(auVar82,auVar89);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar88,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar81);
    auVar81 = vmulps_avx512vl(auVar83,auVar89);
    auVar78 = vmulps_avx512vl(auVar78,auVar89);
    auVar47 = vfmadd231ps_fma(auVar81,auVar88,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar82);
    auVar78 = vmulps_avx512vl(auVar89,auVar79);
    auVar83 = ZEXT1632(auVar49);
    auVar81 = vmulps_avx512vl(auVar83,auVar80);
    auVar74 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar74);
    auVar77 = vfmadd231ps_avx512vl(auVar81,auVar88,auVar77);
    auVar87 = vmulps_avx512vl(auVar83,auVar87);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar223 * auVar47._12_4_,
                                            CONCAT48(fVar213 * auVar47._8_4_,
                                                     CONCAT44(fVar211 * auVar47._4_4_,
                                                              fVar210 * auVar47._0_4_)))),auVar88,
                         auVar79);
    auVar79 = vfmadd231ps_avx512vl(auVar87,auVar88,auVar80);
    auVar87._4_4_ = fVar211 * auVar78._4_4_;
    auVar87._0_4_ = fVar210 * auVar78._0_4_;
    auVar87._8_4_ = fVar213 * auVar78._8_4_;
    auVar87._12_4_ = fVar223 * auVar78._12_4_;
    auVar87._16_4_ = auVar78._16_4_ * 0.0;
    auVar87._20_4_ = auVar78._20_4_ * 0.0;
    auVar87._24_4_ = auVar78._24_4_ * 0.0;
    auVar87._28_4_ = auVar82._28_4_;
    auVar80 = vmulps_avx512vl(auVar83,auVar79);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar88,auVar74);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar88);
    auVar88 = vsubps_avx512vl(auVar78,auVar74);
    auVar74 = vsubps_avx512vl(auVar79,auVar77);
    auVar77 = vmulps_avx512vl(auVar88,auVar72);
    auVar72 = vmulps_avx512vl(auVar74,auVar72);
    fVar201 = fVar212 * auVar77._0_4_;
    fVar210 = fVar212 * auVar77._4_4_;
    auVar88._4_4_ = fVar210;
    auVar88._0_4_ = fVar201;
    fVar211 = fVar212 * auVar77._8_4_;
    auVar88._8_4_ = fVar211;
    fVar213 = fVar212 * auVar77._12_4_;
    auVar88._12_4_ = fVar213;
    fVar223 = fVar212 * auVar77._16_4_;
    auVar88._16_4_ = fVar223;
    fVar224 = fVar212 * auVar77._20_4_;
    auVar88._20_4_ = fVar224;
    fVar212 = fVar212 * auVar77._24_4_;
    auVar88._24_4_ = fVar212;
    auVar88._28_4_ = auVar77._28_4_;
    auVar72 = vmulps_avx512vl(auVar90,auVar72);
    auVar78 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,auVar85);
    auVar79 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar85);
    auVar200._0_4_ = auVar87._0_4_ + fVar201;
    auVar200._4_4_ = auVar87._4_4_ + fVar210;
    auVar200._8_4_ = auVar87._8_4_ + fVar211;
    auVar200._12_4_ = auVar87._12_4_ + fVar213;
    auVar200._16_4_ = auVar87._16_4_ + fVar223;
    auVar200._20_4_ = auVar87._20_4_ + fVar224;
    auVar200._24_4_ = auVar87._24_4_ + fVar212;
    auVar200._28_4_ = auVar87._28_4_ + auVar77._28_4_;
    auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,ZEXT1632(auVar52));
    auVar77 = vaddps_avx512vl(auVar80,auVar72);
    auVar72 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,ZEXT1632(auVar52));
    auVar88 = vsubps_avx(auVar78,auVar88);
    auVar72 = vsubps_avx512vl(auVar79,auVar72);
    auVar92 = ZEXT1632(auVar58);
    auVar74 = vsubps_avx512vl(auVar87,auVar92);
    auVar94 = ZEXT1632(auVar66);
    auVar81 = vsubps_avx512vl(auVar80,auVar94);
    auVar82 = vsubps_avx512vl(auVar78,auVar71);
    auVar74 = vaddps_avx512vl(auVar74,auVar82);
    auVar82 = vsubps_avx512vl(auVar79,auVar73);
    auVar81 = vaddps_avx512vl(auVar81,auVar82);
    auVar82 = vmulps_avx512vl(auVar94,auVar74);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar92,auVar81);
    auVar83 = vmulps_avx512vl(auVar75,auVar74);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar123,auVar81);
    auVar84 = vmulps_avx512vl(auVar76,auVar74);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar86,auVar81);
    auVar85 = vmulps_avx512vl(auVar73,auVar74);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar71,auVar81);
    auVar89 = vmulps_avx512vl(auVar80,auVar74);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar87,auVar81);
    auVar90 = vmulps_avx512vl(auVar77,auVar74);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar200,auVar81);
    auVar91 = vmulps_avx512vl(auVar72,auVar74);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar88,auVar81);
    auVar74 = vmulps_avx512vl(auVar79,auVar74);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar78,auVar81);
    auVar81 = vminps_avx512vl(auVar82,auVar83);
    auVar82 = vmaxps_avx512vl(auVar82,auVar83);
    auVar83 = vminps_avx512vl(auVar84,auVar85);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar83 = vmaxps_avx512vl(auVar84,auVar85);
    auVar82 = vmaxps_avx512vl(auVar82,auVar83);
    auVar83 = vminps_avx512vl(auVar89,auVar90);
    auVar84 = vmaxps_avx512vl(auVar89,auVar90);
    auVar85 = vminps_avx512vl(auVar91,auVar74);
    auVar83 = vminps_avx512vl(auVar83,auVar85);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar74 = vmaxps_avx512vl(auVar91,auVar74);
    auVar74 = vmaxps_avx512vl(auVar84,auVar74);
    auVar82 = vmaxps_avx512vl(auVar82,auVar74);
    uVar12 = vcmpps_avx512vl(auVar81,local_1c0,2);
    auVar74._4_4_ = uStack_1dc;
    auVar74._0_4_ = local_1e0;
    auVar74._8_4_ = uStack_1d8;
    auVar74._12_4_ = uStack_1d4;
    auVar74._16_4_ = uStack_1d0;
    auVar74._20_4_ = uStack_1cc;
    auVar74._24_4_ = uStack_1c8;
    auVar74._28_4_ = uStack_1c4;
    uVar13 = vcmpps_avx512vl(auVar82,auVar74,5);
    bVar27 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar27 == 0) {
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar242 = ZEXT1664(auVar44);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar243 = ZEXT3264(auVar88);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar244 = ZEXT1664(auVar44);
      auVar245 = ZEXT3264(_DAT_01fb9fe0);
    }
    else {
      auVar81 = vsubps_avx512vl(auVar71,auVar92);
      auVar82 = vsubps_avx512vl(auVar73,auVar94);
      auVar83 = vsubps_avx512vl(auVar78,auVar87);
      auVar81 = vaddps_avx512vl(auVar81,auVar83);
      auVar83 = vsubps_avx512vl(auVar79,auVar80);
      auVar82 = vaddps_avx512vl(auVar82,auVar83);
      auVar83 = vmulps_avx512vl(auVar94,auVar81);
      auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar82,auVar92);
      auVar75 = vmulps_avx512vl(auVar75,auVar81);
      auVar75 = vfnmadd213ps_avx512vl(auVar123,auVar82,auVar75);
      auVar76 = vmulps_avx512vl(auVar76,auVar81);
      auVar76 = vfnmadd213ps_avx512vl(auVar86,auVar82,auVar76);
      auVar86 = vmulps_avx512vl(auVar73,auVar81);
      auVar73 = vfnmadd231ps_avx512vl(auVar86,auVar82,auVar71);
      auVar86 = vmulps_avx512vl(auVar80,auVar81);
      auVar80 = vfnmadd231ps_avx512vl(auVar86,auVar82,auVar87);
      auVar86 = vmulps_avx512vl(auVar77,auVar81);
      auVar77 = vfnmadd213ps_avx512vl(auVar200,auVar82,auVar86);
      auVar86 = vmulps_avx512vl(auVar72,auVar81);
      auVar84 = vfnmadd213ps_avx512vl(auVar88,auVar82,auVar86);
      auVar88 = vmulps_avx512vl(auVar79,auVar81);
      auVar78 = vfnmadd231ps_avx512vl(auVar88,auVar78,auVar82);
      auVar86 = vminps_avx(auVar83,auVar75);
      auVar88 = vmaxps_avx(auVar83,auVar75);
      auVar71 = vminps_avx(auVar76,auVar73);
      auVar71 = vminps_avx(auVar86,auVar71);
      auVar86 = vmaxps_avx(auVar76,auVar73);
      auVar88 = vmaxps_avx(auVar88,auVar86);
      auVar87 = vminps_avx(auVar80,auVar77);
      auVar86 = vmaxps_avx(auVar80,auVar77);
      auVar72 = vminps_avx(auVar84,auVar78);
      auVar87 = vminps_avx(auVar87,auVar72);
      auVar87 = vminps_avx(auVar71,auVar87);
      auVar71 = vmaxps_avx(auVar84,auVar78);
      auVar86 = vmaxps_avx(auVar86,auVar71);
      auVar88 = vmaxps_avx(auVar88,auVar86);
      uVar12 = vcmpps_avx512vl(auVar88,auVar74,5);
      uVar13 = vcmpps_avx512vl(auVar87,local_1c0,2);
      bVar27 = bVar27 & (byte)uVar12 & (byte)uVar13;
      if (bVar27 != 0) {
        auStack_430[uVar29] = (uint)bVar27;
        uVar12 = vmovlps_avx(auVar44);
        (&uStack_260)[uVar29] = uVar12;
        uVar35 = vmovlps_avx(auVar67);
        auStack_1a0[uVar29] = uVar35;
        uVar29 = (ulong)((int)uVar29 + 1);
      }
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar242 = ZEXT1664(auVar44);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar243 = ZEXT3264(auVar88);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar244 = ZEXT1664(auVar44);
      auVar245 = ZEXT3264(_DAT_01fb9fe0);
    }
LAB_01815cac:
    do {
      do {
        do {
          auVar47 = auVar247._0_16_;
          auVar49 = SUB6416(ZEXT464(0xb8d1b717),0);
          if ((int)uVar29 == 0) {
            uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar19._4_4_ = uVar109;
            auVar19._0_4_ = uVar109;
            auVar19._8_4_ = uVar109;
            auVar19._12_4_ = uVar109;
            uVar12 = vcmpps_avx512vl(local_400,auVar19,2);
            uVar34 = (ulong)((uint)uVar34 & (uint)uVar12);
            goto LAB_01814fe5;
          }
          uVar28 = (int)uVar29 - 1;
          uVar30 = (ulong)uVar28;
          uVar5 = auStack_430[uVar30];
          auVar67._8_8_ = 0;
          auVar67._0_8_ = auStack_1a0[uVar30];
          uVar35 = 0;
          for (uVar33 = (ulong)uVar5; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000)
          {
            uVar35 = uVar35 + 1;
          }
          uVar32 = uVar5 - 1 & uVar5;
          bVar38 = uVar32 == 0;
          auStack_430[uVar30] = uVar32;
          if (bVar38) {
            uVar29 = (ulong)uVar28;
          }
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar35;
          auVar44 = vpunpcklqdq_avx(auVar105,ZEXT416((int)uVar35 + 1));
          auVar44 = vcvtqq2ps_avx512vl(auVar44);
          auVar44 = vmulps_avx512vl(auVar44,auVar244._0_16_);
          uVar109 = *(undefined4 *)((long)&uStack_260 + uVar30 * 8 + 4);
          auVar14._4_4_ = uVar109;
          auVar14._0_4_ = uVar109;
          auVar14._8_4_ = uVar109;
          auVar14._12_4_ = uVar109;
          auVar52 = vmulps_avx512vl(auVar44,auVar14);
          auVar44 = vsubps_avx512vl(auVar47,auVar44);
          uVar109 = *(undefined4 *)(&uStack_260 + uVar30);
          auVar15._4_4_ = uVar109;
          auVar15._0_4_ = uVar109;
          auVar15._8_4_ = uVar109;
          auVar15._12_4_ = uVar109;
          auVar44 = vfmadd231ps_avx512vl(auVar52,auVar44,auVar15);
          auVar52 = vmovshdup_avx(auVar44);
          fVar212 = auVar52._0_4_ - auVar44._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar212));
          if (uVar5 == 0 || bVar38) goto LAB_01815746;
          auVar52 = vshufps_avx(auVar67,auVar67,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar212));
          bVar36 = (uint)uVar29 < 4;
          uVar28 = (uint)uVar29 - 4;
          bVar39 = uVar28 == 0;
          bVar37 = (POPCOUNT(uVar28 & 0xff) & 1U) == 0;
          auVar58 = vsubps_avx512vl(auVar47,auVar52);
          fVar201 = auVar52._0_4_;
          auVar149._0_4_ = fVar201 * fVar116;
          fVar210 = auVar52._4_4_;
          auVar149._4_4_ = fVar210 * fVar124;
          fVar211 = auVar52._8_4_;
          auVar149._8_4_ = fVar211 * fVar116;
          fVar213 = auVar52._12_4_;
          auVar149._12_4_ = fVar213 * fVar124;
          auVar163._0_4_ = fVar201 * fVar125;
          auVar163._4_4_ = fVar210 * fVar126;
          auVar163._8_4_ = fVar211 * fVar125;
          auVar163._12_4_ = fVar213 * fVar126;
          auVar169._0_4_ = fVar201 * fVar137;
          auVar169._4_4_ = fVar210 * fVar142;
          auVar169._8_4_ = fVar211 * fVar137;
          auVar169._12_4_ = fVar213 * fVar142;
          auVar132._0_4_ = fVar201 * fVar143;
          auVar132._4_4_ = fVar210 * fVar144;
          auVar132._8_4_ = fVar211 * fVar143;
          auVar132._12_4_ = fVar213 * fVar144;
          auVar52 = vfmadd231ps_fma(auVar149,auVar58,auVar45);
          auVar53 = vfmadd231ps_fma(auVar163,auVar58,auVar55);
          auVar57 = vfmadd231ps_fma(auVar169,auVar58,auVar56);
          auVar58 = vfmadd231ps_fma(auVar132,auVar58,auVar54);
          auVar79._16_16_ = auVar52;
          auVar79._0_16_ = auVar52;
          auVar80._16_16_ = auVar53;
          auVar80._0_16_ = auVar53;
          auVar82._16_16_ = auVar57;
          auVar82._0_16_ = auVar57;
          auVar86 = vpermps_avx512vl(auVar245._0_32_,ZEXT1632(auVar44));
          auVar88 = vsubps_avx(auVar80,auVar79);
          auVar53 = vfmadd213ps_fma(auVar88,auVar86,auVar79);
          auVar88 = vsubps_avx(auVar82,auVar80);
          auVar66 = vfmadd213ps_fma(auVar88,auVar86,auVar80);
          auVar52 = vsubps_avx(auVar58,auVar57);
          auVar81._16_16_ = auVar52;
          auVar81._0_16_ = auVar52;
          auVar52 = vfmadd213ps_fma(auVar81,auVar86,auVar82);
          auVar88 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar53));
          auVar53 = vfmadd213ps_fma(auVar88,auVar86,ZEXT1632(auVar53));
          auVar88 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar66));
          auVar52 = vfmadd213ps_fma(auVar88,auVar86,ZEXT1632(auVar66));
          auVar88 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar53));
          auVar145 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar88,auVar86);
          auVar88 = vmulps_avx512vl(auVar88,auVar243._0_32_);
          auVar78._16_16_ = auVar88._16_16_;
          auVar52 = vmulss_avx512f(ZEXT416((uint)fVar212),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar201 = auVar52._0_4_;
          auVar170._0_8_ =
               CONCAT44(auVar145._4_4_ + fVar201 * auVar88._4_4_,
                        auVar145._0_4_ + fVar201 * auVar88._0_4_);
          auVar170._8_4_ = auVar145._8_4_ + fVar201 * auVar88._8_4_;
          auVar170._12_4_ = auVar145._12_4_ + fVar201 * auVar88._12_4_;
          auVar150._0_4_ = fVar201 * auVar88._16_4_;
          auVar150._4_4_ = fVar201 * auVar88._20_4_;
          auVar150._8_4_ = fVar201 * auVar88._24_4_;
          auVar150._12_4_ = fVar201 * auVar88._28_4_;
          auVar64 = vsubps_avx((undefined1  [16])0x0,auVar150);
          auVar66 = vshufpd_avx(auVar145,auVar145,3);
          auVar70 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar52 = vsubps_avx(auVar66,auVar145);
          auVar53 = vsubps_avx(auVar70,(undefined1  [16])0x0);
          auVar189._0_4_ = auVar52._0_4_ + auVar53._0_4_;
          auVar189._4_4_ = auVar52._4_4_ + auVar53._4_4_;
          auVar189._8_4_ = auVar52._8_4_ + auVar53._8_4_;
          auVar189._12_4_ = auVar52._12_4_ + auVar53._12_4_;
          auVar52 = vshufps_avx(auVar145,auVar145,0xb1);
          auVar53 = vshufps_avx(auVar170,auVar170,0xb1);
          auVar57 = vshufps_avx(auVar64,auVar64,0xb1);
          auVar58 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar236._4_4_ = auVar189._0_4_;
          auVar236._0_4_ = auVar189._0_4_;
          auVar236._8_4_ = auVar189._0_4_;
          auVar236._12_4_ = auVar189._0_4_;
          auVar61 = vshufps_avx(auVar189,auVar189,0x55);
          fVar201 = auVar61._0_4_;
          auVar198._0_4_ = auVar52._0_4_ * fVar201;
          fVar210 = auVar61._4_4_;
          auVar198._4_4_ = auVar52._4_4_ * fVar210;
          fVar211 = auVar61._8_4_;
          auVar198._8_4_ = auVar52._8_4_ * fVar211;
          fVar213 = auVar61._12_4_;
          auVar198._12_4_ = auVar52._12_4_ * fVar213;
          auVar203._0_4_ = auVar53._0_4_ * fVar201;
          auVar203._4_4_ = auVar53._4_4_ * fVar210;
          auVar203._8_4_ = auVar53._8_4_ * fVar211;
          auVar203._12_4_ = auVar53._12_4_ * fVar213;
          auVar215._0_4_ = auVar57._0_4_ * fVar201;
          auVar215._4_4_ = auVar57._4_4_ * fVar210;
          auVar215._8_4_ = auVar57._8_4_ * fVar211;
          auVar215._12_4_ = auVar57._12_4_ * fVar213;
          auVar190._0_4_ = auVar58._0_4_ * fVar201;
          auVar190._4_4_ = auVar58._4_4_ * fVar210;
          auVar190._8_4_ = auVar58._8_4_ * fVar211;
          auVar190._12_4_ = auVar58._12_4_ * fVar213;
          auVar52 = vfmadd231ps_fma(auVar198,auVar236,auVar145);
          auVar53 = vfmadd231ps_fma(auVar203,auVar236,auVar170);
          auVar63 = vfmadd231ps_fma(auVar215,auVar236,auVar64);
          auVar69 = vfmadd231ps_fma(auVar190,(undefined1  [16])0x0,auVar236);
          auVar61 = vshufpd_avx(auVar52,auVar52,1);
          auVar62 = vshufpd_avx(auVar53,auVar53,1);
          auVar59 = vshufpd_avx512vl(auVar63,auVar63,1);
          auVar60 = vshufpd_avx512vl(auVar69,auVar69,1);
          auVar57 = vminss_avx(auVar52,auVar53);
          auVar52 = vmaxss_avx(auVar53,auVar52);
          auVar58 = vminss_avx(auVar63,auVar69);
          auVar53 = vmaxss_avx(auVar69,auVar63);
          auVar57 = vminss_avx(auVar57,auVar58);
          auVar52 = vmaxss_avx(auVar53,auVar52);
          auVar58 = vminss_avx(auVar61,auVar62);
          auVar53 = vmaxss_avx(auVar62,auVar61);
          auVar61 = vminss_avx512f(auVar59,auVar60);
          auVar62 = vmaxss_avx512f(auVar60,auVar59);
          vmaxss_avx(auVar62,auVar53);
          auVar53 = vminss_avx512f(auVar58,auVar61);
          vucomiss_avx512f(auVar57);
          if ((!bVar36 && !bVar39) &&
             (auVar58 = vucomiss_avx512f(auVar49), bVar40 = bVar39, !bVar36 && !bVar39)) break;
          auVar58 = vucomiss_avx512f(auVar49);
          auVar61 = vucomiss_avx512f(auVar53);
          auVar52 = vucomiss_avx512f(auVar49);
          bVar40 = bVar36 || bVar39;
          bVar37 = bVar36 || bVar39;
          if (!bVar36 && !bVar39) break;
          uVar12 = vcmpps_avx512vl(auVar57,auVar61,5);
          uVar13 = vcmpps_avx512vl(auVar53,auVar61,5);
          uVar28 = (uint)uVar12 & (uint)uVar13;
          bVar10 = (uVar28 & 1) == 0;
          bVar40 = (!bVar36 && !bVar39) && bVar10;
          bVar37 = (!bVar36 && !bVar39) && (uVar28 & 1) == 0;
        } while ((bVar36 || bVar39) || !bVar10);
        auVar62 = auVar248._0_16_;
        vcmpss_avx512f(auVar57,auVar62,1);
        uVar12 = vcmpss_avx512f(auVar52,auVar62,1);
        bVar39 = (bool)((byte)uVar12 & 1);
        auVar78._0_16_ = auVar249._0_16_;
        auVar92._4_28_ = auVar78._4_28_;
        auVar92._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar249._0_4_);
        vucomiss_avx512f(auVar92._0_16_);
        bVar37 = (bool)(!bVar40 | bVar37);
        bVar40 = bVar37 == false;
        auVar94._16_16_ = auVar78._16_16_;
        auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar93._4_28_ = auVar94._4_28_;
        auVar93._0_4_ = (uint)bVar37 * auVar248._0_4_ + (uint)!bVar37 * 0x7f800000;
        auVar61 = auVar93._0_16_;
        auVar96._16_16_ = auVar78._16_16_;
        auVar96._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar37 * auVar248._0_4_ + (uint)!bVar37 * -0x800000;
        auVar49 = auVar95._0_16_;
        uVar12 = vcmpss_avx512f(auVar53,auVar62,1);
        bVar39 = (bool)((byte)uVar12 & 1);
        auVar98._16_16_ = auVar78._16_16_;
        auVar98._0_16_ = auVar249._0_16_;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar249._0_4_);
        vucomiss_avx512f(auVar97._0_16_);
        if ((bVar37) || (bVar40)) {
          auVar53 = vucomiss_avx512f(auVar57);
          if ((bVar37) || (bVar40)) {
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar63 = vxorps_avx512vl(auVar57,auVar18);
            auVar53 = vsubss_avx512f(auVar53,auVar57);
            auVar53 = vdivss_avx512f(auVar63,auVar53);
            auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
            auVar57 = vfmadd213ss_avx512f(auVar57,auVar62,auVar53);
            auVar53 = auVar57;
          }
          else {
            auVar53 = vxorps_avx512vl(auVar53,auVar53);
            vucomiss_avx512f(auVar53);
            auVar57 = ZEXT416(0x3f800000);
            if ((bVar37) || (bVar40)) {
              auVar57 = SUB6416(ZEXT464(0xff800000),0);
              auVar53 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar61 = vminss_avx512f(auVar61,auVar53);
          auVar49 = vmaxss_avx(auVar57,auVar49);
        }
        auVar249 = ZEXT464(0x3f800000);
        uVar12 = vcmpss_avx512f(auVar58,auVar62,1);
        bVar37 = (bool)((byte)uVar12 & 1);
        auVar53 = auVar249._0_16_;
        fVar201 = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * 0x3f800000);
        if ((auVar92._0_4_ != fVar201) || (NAN(auVar92._0_4_) || NAN(fVar201))) {
          fVar211 = auVar58._0_4_;
          fVar210 = auVar52._0_4_;
          if ((fVar211 != fVar210) || (NAN(fVar211) || NAN(fVar210))) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar52 = vxorps_avx512vl(auVar52,auVar17);
            auVar191._0_4_ = auVar52._0_4_ / (fVar211 - fVar210);
            auVar191._4_12_ = auVar52._4_12_;
            auVar52 = vsubss_avx512f(auVar53,auVar191);
            auVar52 = vfmadd213ss_avx512f(auVar52,auVar62,auVar191);
            auVar57 = auVar52;
          }
          else if ((fVar210 != 0.0) ||
                  (auVar52 = auVar53, auVar57 = ZEXT816(0) << 0x40, NAN(fVar210))) {
            auVar52 = SUB6416(ZEXT464(0xff800000),0);
            auVar57 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar61 = vminss_avx(auVar61,auVar57);
          auVar49 = vmaxss_avx(auVar52,auVar49);
        }
        bVar37 = auVar97._0_4_ != fVar201;
        auVar52 = vminss_avx512f(auVar61,auVar53);
        auVar100._16_16_ = auVar78._16_16_;
        auVar100._0_16_ = auVar61;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar37 * auVar52._0_4_ + (uint)!bVar37 * auVar61._0_4_;
        auVar52 = vmaxss_avx512f(auVar53,auVar49);
        auVar102._16_16_ = auVar78._16_16_;
        auVar102._0_16_ = auVar49;
        auVar101._4_28_ = auVar102._4_28_;
        auVar101._0_4_ = (uint)bVar37 * auVar52._0_4_ + (uint)!bVar37 * auVar49._0_4_;
        auVar49 = vmaxss_avx512f(auVar62,auVar99._0_16_);
        auVar52 = vminss_avx512f(auVar101._0_16_,auVar53);
      } while (auVar52._0_4_ < auVar49._0_4_);
      auVar58 = vmaxss_avx512f(auVar62,ZEXT416((uint)(auVar49._0_4_ + -0.1)));
      auVar63 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar53);
      auVar133._0_8_ = auVar145._0_8_;
      auVar133._8_8_ = auVar133._0_8_;
      auVar204._8_8_ = auVar170._0_8_;
      auVar204._0_8_ = auVar170._0_8_;
      auVar216._8_8_ = auVar64._0_8_;
      auVar216._0_8_ = auVar64._0_8_;
      auVar49 = vshufpd_avx(auVar170,auVar170,3);
      auVar52 = vshufpd_avx(auVar64,auVar64,3);
      auVar57 = vshufps_avx(auVar58,auVar63,0);
      auVar62 = vsubps_avx512vl(auVar47,auVar57);
      fVar201 = auVar57._0_4_;
      auVar164._0_4_ = fVar201 * auVar66._0_4_;
      fVar210 = auVar57._4_4_;
      auVar164._4_4_ = fVar210 * auVar66._4_4_;
      fVar211 = auVar57._8_4_;
      auVar164._8_4_ = fVar211 * auVar66._8_4_;
      fVar213 = auVar57._12_4_;
      auVar164._12_4_ = fVar213 * auVar66._12_4_;
      auVar171._0_4_ = fVar201 * auVar49._0_4_;
      auVar171._4_4_ = fVar210 * auVar49._4_4_;
      auVar171._8_4_ = fVar211 * auVar49._8_4_;
      auVar171._12_4_ = fVar213 * auVar49._12_4_;
      auVar238._0_4_ = auVar52._0_4_ * fVar201;
      auVar238._4_4_ = auVar52._4_4_ * fVar210;
      auVar238._8_4_ = auVar52._8_4_ * fVar211;
      auVar238._12_4_ = auVar52._12_4_ * fVar213;
      auVar151._0_4_ = fVar201 * auVar70._0_4_;
      auVar151._4_4_ = fVar210 * auVar70._4_4_;
      auVar151._8_4_ = fVar211 * auVar70._8_4_;
      auVar151._12_4_ = fVar213 * auVar70._12_4_;
      auVar66 = vfmadd231ps_fma(auVar164,auVar62,auVar133);
      auVar70 = vfmadd231ps_fma(auVar171,auVar62,auVar204);
      auVar61 = vfmadd231ps_fma(auVar238,auVar62,auVar216);
      auVar62 = vfmadd231ps_fma(auVar151,auVar62,ZEXT816(0));
      auVar52 = vsubss_avx512f(auVar53,auVar58);
      auVar49 = vmovshdup_avx(auVar67);
      auVar145 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar58._0_4_)),auVar67,auVar52);
      auVar52 = vsubss_avx512f(auVar53,auVar63);
      auVar59 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar63._0_4_)),auVar67,auVar52);
      auVar64 = vdivss_avx512f(auVar53,ZEXT416((uint)fVar212));
      auVar49 = vsubps_avx(auVar70,auVar66);
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar57 = vmulps_avx512vl(auVar49,auVar63);
      auVar49 = vsubps_avx(auVar61,auVar70);
      auVar58 = vmulps_avx512vl(auVar49,auVar63);
      auVar49 = vsubps_avx(auVar62,auVar61);
      auVar49 = vmulps_avx512vl(auVar49,auVar63);
      auVar52 = vminps_avx(auVar58,auVar49);
      auVar49 = vmaxps_avx(auVar58,auVar49);
      auVar52 = vminps_avx(auVar57,auVar52);
      auVar49 = vmaxps_avx(auVar57,auVar49);
      auVar57 = vshufpd_avx(auVar52,auVar52,3);
      auVar58 = vshufpd_avx(auVar49,auVar49,3);
      auVar52 = vminps_avx(auVar52,auVar57);
      auVar49 = vmaxps_avx(auVar49,auVar58);
      fVar212 = auVar64._0_4_;
      auVar192._0_4_ = auVar52._0_4_ * fVar212;
      auVar192._4_4_ = auVar52._4_4_ * fVar212;
      auVar192._8_4_ = auVar52._8_4_ * fVar212;
      auVar192._12_4_ = auVar52._12_4_ * fVar212;
      auVar178._0_4_ = fVar212 * auVar49._0_4_;
      auVar178._4_4_ = fVar212 * auVar49._4_4_;
      auVar178._8_4_ = fVar212 * auVar49._8_4_;
      auVar178._12_4_ = fVar212 * auVar49._12_4_;
      auVar64 = vdivss_avx512f(auVar53,ZEXT416((uint)(auVar59._0_4_ - auVar145._0_4_)));
      auVar49 = vshufpd_avx(auVar66,auVar66,3);
      auVar52 = vshufpd_avx(auVar70,auVar70,3);
      auVar57 = vshufpd_avx(auVar61,auVar61,3);
      auVar58 = vshufpd_avx(auVar62,auVar62,3);
      auVar49 = vsubps_avx(auVar49,auVar66);
      auVar66 = vsubps_avx(auVar52,auVar70);
      auVar70 = vsubps_avx(auVar57,auVar61);
      auVar58 = vsubps_avx(auVar58,auVar62);
      auVar52 = vminps_avx(auVar49,auVar66);
      auVar49 = vmaxps_avx(auVar49,auVar66);
      auVar57 = vminps_avx(auVar70,auVar58);
      auVar57 = vminps_avx(auVar52,auVar57);
      auVar52 = vmaxps_avx(auVar70,auVar58);
      auVar49 = vmaxps_avx(auVar49,auVar52);
      fVar212 = auVar64._0_4_;
      auVar217._0_4_ = fVar212 * auVar57._0_4_;
      auVar217._4_4_ = fVar212 * auVar57._4_4_;
      auVar217._8_4_ = fVar212 * auVar57._8_4_;
      auVar217._12_4_ = fVar212 * auVar57._12_4_;
      auVar205._0_4_ = fVar212 * auVar49._0_4_;
      auVar205._4_4_ = fVar212 * auVar49._4_4_;
      auVar205._8_4_ = fVar212 * auVar49._8_4_;
      auVar205._12_4_ = fVar212 * auVar49._12_4_;
      auVar58 = vinsertps_avx(auVar44,auVar145,0x10);
      auVar60 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9f90,auVar59);
      auVar115._0_4_ = auVar58._0_4_ + auVar60._0_4_;
      auVar115._4_4_ = auVar58._4_4_ + auVar60._4_4_;
      auVar115._8_4_ = auVar58._8_4_ + auVar60._8_4_;
      auVar115._12_4_ = auVar58._12_4_ + auVar60._12_4_;
      auVar64 = vmulps_avx512vl(auVar115,auVar242._0_16_);
      auVar52 = vshufps_avx(auVar64,auVar64,0x54);
      uVar109 = auVar64._0_4_;
      auVar122._4_4_ = uVar109;
      auVar122._0_4_ = uVar109;
      auVar122._8_4_ = uVar109;
      auVar122._12_4_ = uVar109;
      auVar57 = vfmadd213ps_fma(local_270,auVar122,auVar41);
      auVar66 = vfmadd213ps_fma(local_280,auVar122,auVar46);
      auVar70 = vfmadd213ps_fma(local_290,auVar122,auVar42);
      auVar49 = vsubps_avx(auVar66,auVar57);
      auVar57 = vfmadd213ps_fma(auVar49,auVar122,auVar57);
      auVar49 = vsubps_avx(auVar70,auVar66);
      auVar49 = vfmadd213ps_fma(auVar49,auVar122,auVar66);
      auVar49 = vsubps_avx(auVar49,auVar57);
      auVar57 = vfmadd231ps_fma(auVar57,auVar49,auVar122);
      auVar61 = vmulps_avx512vl(auVar49,auVar63);
      auVar228._8_8_ = auVar57._0_8_;
      auVar228._0_8_ = auVar57._0_8_;
      auVar49 = vshufpd_avx(auVar57,auVar57,3);
      auVar57 = vshufps_avx(auVar64,auVar64,0x55);
      auVar66 = vsubps_avx(auVar49,auVar228);
      auVar70 = vfmadd231ps_fma(auVar228,auVar57,auVar66);
      auVar239._8_8_ = auVar61._0_8_;
      auVar239._0_8_ = auVar61._0_8_;
      auVar49 = vshufpd_avx(auVar61,auVar61,3);
      auVar49 = vsubps_avx512vl(auVar49,auVar239);
      auVar49 = vfmadd213ps_avx512vl(auVar49,auVar57,auVar239);
      auVar57 = vxorps_avx512vl(auVar66,auVar250._0_16_);
      auVar61 = vmovshdup_avx512vl(auVar49);
      auVar62 = vxorps_avx512vl(auVar61,auVar250._0_16_);
      auVar63 = vmovshdup_avx512vl(auVar66);
      auVar62 = vpermt2ps_avx512vl(auVar62,ZEXT416(5),auVar66);
      auVar65 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar248 = ZEXT1664(auVar65);
      auVar66 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar61._0_4_ * auVar66._0_4_)),auVar49,auVar63);
      auVar57 = vpermt2ps_avx512vl(auVar49,SUB6416(ZEXT464(4),0),auVar57);
      auVar152._0_4_ = auVar66._0_4_;
      auVar152._4_4_ = auVar152._0_4_;
      auVar152._8_4_ = auVar152._0_4_;
      auVar152._12_4_ = auVar152._0_4_;
      auVar49 = vdivps_avx(auVar62,auVar152);
      auVar67 = vdivps_avx512vl(auVar57,auVar152);
      fVar212 = auVar70._0_4_;
      auVar57 = vshufps_avx(auVar70,auVar70,0x55);
      auVar229._0_4_ = fVar212 * auVar49._0_4_ + auVar57._0_4_ * auVar67._0_4_;
      auVar229._4_4_ = fVar212 * auVar49._4_4_ + auVar57._4_4_ * auVar67._4_4_;
      auVar229._8_4_ = fVar212 * auVar49._8_4_ + auVar57._8_4_ * auVar67._8_4_;
      auVar229._12_4_ = fVar212 * auVar49._12_4_ + auVar57._12_4_ * auVar67._12_4_;
      auVar63 = vsubps_avx(auVar52,auVar229);
      auVar57 = vmovshdup_avx(auVar49);
      auVar52 = vinsertps_avx(auVar192,auVar217,0x1c);
      auVar240._0_4_ = auVar57._0_4_ * auVar52._0_4_;
      auVar240._4_4_ = auVar57._4_4_ * auVar52._4_4_;
      auVar240._8_4_ = auVar57._8_4_ * auVar52._8_4_;
      auVar240._12_4_ = auVar57._12_4_ * auVar52._12_4_;
      auVar69 = vinsertps_avx512f(auVar178,auVar205,0x1c);
      auVar57 = vmulps_avx512vl(auVar57,auVar69);
      auVar62 = vminps_avx512vl(auVar240,auVar57);
      auVar70 = vmaxps_avx(auVar57,auVar240);
      auVar61 = vmovshdup_avx(auVar67);
      auVar57 = vinsertps_avx(auVar217,auVar192,0x4c);
      auVar218._0_4_ = auVar61._0_4_ * auVar57._0_4_;
      auVar218._4_4_ = auVar61._4_4_ * auVar57._4_4_;
      auVar218._8_4_ = auVar61._8_4_ * auVar57._8_4_;
      auVar218._12_4_ = auVar61._12_4_ * auVar57._12_4_;
      auVar66 = vinsertps_avx(auVar205,auVar178,0x4c);
      auVar206._0_4_ = auVar61._0_4_ * auVar66._0_4_;
      auVar206._4_4_ = auVar61._4_4_ * auVar66._4_4_;
      auVar206._8_4_ = auVar61._8_4_ * auVar66._8_4_;
      auVar206._12_4_ = auVar61._12_4_ * auVar66._12_4_;
      auVar61 = vminps_avx(auVar218,auVar206);
      auVar62 = vaddps_avx512vl(auVar62,auVar61);
      auVar61 = vmaxps_avx(auVar206,auVar218);
      auVar207._0_4_ = auVar70._0_4_ + auVar61._0_4_;
      auVar207._4_4_ = auVar70._4_4_ + auVar61._4_4_;
      auVar207._8_4_ = auVar70._8_4_ + auVar61._8_4_;
      auVar207._12_4_ = auVar70._12_4_ + auVar61._12_4_;
      auVar219._8_8_ = 0x3f80000000000000;
      auVar219._0_8_ = 0x3f80000000000000;
      auVar70 = vsubps_avx(auVar219,auVar207);
      auVar61 = vsubps_avx(auVar219,auVar62);
      auVar62 = vsubps_avx(auVar58,auVar64);
      auVar64 = vsubps_avx(auVar60,auVar64);
      fVar213 = auVar62._0_4_;
      auVar241._0_4_ = fVar213 * auVar70._0_4_;
      fVar223 = auVar62._4_4_;
      auVar241._4_4_ = fVar223 * auVar70._4_4_;
      fVar224 = auVar62._8_4_;
      auVar241._8_4_ = fVar224 * auVar70._8_4_;
      fVar225 = auVar62._12_4_;
      auVar241._12_4_ = fVar225 * auVar70._12_4_;
      auVar68 = vbroadcastss_avx512vl(auVar49);
      auVar52 = vmulps_avx512vl(auVar68,auVar52);
      auVar69 = vmulps_avx512vl(auVar68,auVar69);
      auVar68 = vminps_avx512vl(auVar52,auVar69);
      auVar69 = vmaxps_avx512vl(auVar69,auVar52);
      auVar52 = vbroadcastss_avx512vl(auVar67);
      auVar57 = vmulps_avx512vl(auVar52,auVar57);
      auVar52 = vmulps_avx512vl(auVar52,auVar66);
      auVar66 = vminps_avx512vl(auVar57,auVar52);
      auVar66 = vaddps_avx512vl(auVar68,auVar66);
      auVar62 = vmulps_avx512vl(auVar62,auVar61);
      fVar212 = auVar64._0_4_;
      auVar208._0_4_ = fVar212 * auVar70._0_4_;
      fVar201 = auVar64._4_4_;
      auVar208._4_4_ = fVar201 * auVar70._4_4_;
      fVar210 = auVar64._8_4_;
      auVar208._8_4_ = fVar210 * auVar70._8_4_;
      fVar211 = auVar64._12_4_;
      auVar208._12_4_ = fVar211 * auVar70._12_4_;
      auVar220._0_4_ = fVar212 * auVar61._0_4_;
      auVar220._4_4_ = fVar201 * auVar61._4_4_;
      auVar220._8_4_ = fVar210 * auVar61._8_4_;
      auVar220._12_4_ = fVar211 * auVar61._12_4_;
      auVar52 = vmaxps_avx(auVar52,auVar57);
      auVar179._0_4_ = auVar69._0_4_ + auVar52._0_4_;
      auVar179._4_4_ = auVar69._4_4_ + auVar52._4_4_;
      auVar179._8_4_ = auVar69._8_4_ + auVar52._8_4_;
      auVar179._12_4_ = auVar69._12_4_ + auVar52._12_4_;
      auVar193._8_8_ = 0x3f800000;
      auVar193._0_8_ = 0x3f800000;
      auVar52 = vsubps_avx(auVar193,auVar179);
      auVar57 = vsubps_avx512vl(auVar193,auVar66);
      auVar237._0_4_ = fVar213 * auVar52._0_4_;
      auVar237._4_4_ = fVar223 * auVar52._4_4_;
      auVar237._8_4_ = fVar224 * auVar52._8_4_;
      auVar237._12_4_ = fVar225 * auVar52._12_4_;
      auVar230._0_4_ = fVar213 * auVar57._0_4_;
      auVar230._4_4_ = fVar223 * auVar57._4_4_;
      auVar230._8_4_ = fVar224 * auVar57._8_4_;
      auVar230._12_4_ = fVar225 * auVar57._12_4_;
      auVar180._0_4_ = fVar212 * auVar52._0_4_;
      auVar180._4_4_ = fVar201 * auVar52._4_4_;
      auVar180._8_4_ = fVar210 * auVar52._8_4_;
      auVar180._12_4_ = fVar211 * auVar52._12_4_;
      auVar194._0_4_ = fVar212 * auVar57._0_4_;
      auVar194._4_4_ = fVar201 * auVar57._4_4_;
      auVar194._8_4_ = fVar210 * auVar57._8_4_;
      auVar194._12_4_ = fVar211 * auVar57._12_4_;
      auVar52 = vminps_avx(auVar237,auVar230);
      auVar57 = vminps_avx512vl(auVar180,auVar194);
      auVar66 = vminps_avx512vl(auVar52,auVar57);
      auVar52 = vmaxps_avx(auVar230,auVar237);
      auVar57 = vmaxps_avx(auVar194,auVar180);
      auVar57 = vmaxps_avx(auVar57,auVar52);
      auVar70 = vminps_avx512vl(auVar241,auVar62);
      auVar52 = vminps_avx(auVar208,auVar220);
      auVar52 = vminps_avx(auVar70,auVar52);
      auVar52 = vhaddps_avx(auVar66,auVar52);
      auVar70 = vmaxps_avx512vl(auVar62,auVar241);
      auVar66 = vmaxps_avx(auVar220,auVar208);
      auVar66 = vmaxps_avx(auVar66,auVar70);
      auVar57 = vhaddps_avx(auVar57,auVar66);
      auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
      auVar57 = vshufps_avx(auVar57,auVar57,0xe8);
      auVar181._0_4_ = auVar52._0_4_ + auVar63._0_4_;
      auVar181._4_4_ = auVar52._4_4_ + auVar63._4_4_;
      auVar181._8_4_ = auVar52._8_4_ + auVar63._8_4_;
      auVar181._12_4_ = auVar52._12_4_ + auVar63._12_4_;
      auVar195._0_4_ = auVar57._0_4_ + auVar63._0_4_;
      auVar195._4_4_ = auVar57._4_4_ + auVar63._4_4_;
      auVar195._8_4_ = auVar57._8_4_ + auVar63._8_4_;
      auVar195._12_4_ = auVar57._12_4_ + auVar63._12_4_;
      auVar52 = vmaxps_avx(auVar58,auVar181);
      auVar57 = vminps_avx(auVar195,auVar60);
      uVar35 = vcmpps_avx512vl(auVar57,auVar52,1);
    } while ((uVar35 & 3) != 0);
    uVar35 = vcmpps_avx512vl(auVar195,auVar60,1);
    uVar12 = vcmpps_avx512vl(auVar44,auVar181,1);
    if (((ushort)uVar12 & (ushort)uVar35 & 1) == 0) {
      bVar27 = 0;
    }
    else {
      auVar52 = vmovshdup_avx(auVar181);
      bVar27 = auVar145._0_4_ < auVar52._0_4_ & (byte)(uVar35 >> 1) & 0x7f;
    }
    if (((!bVar36 || uVar5 != 0 && !bVar38) | bVar27) == 1) {
      lVar31 = 0xc9;
      do {
        lVar31 = lVar31 + -1;
        if (lVar31 == 0) goto LAB_01815cac;
        auVar44 = vsubss_avx512f(auVar53,auVar63);
        fVar210 = auVar44._0_4_;
        fVar212 = fVar210 * fVar210 * fVar210;
        fVar211 = auVar63._0_4_;
        fVar201 = fVar211 * 3.0 * fVar210 * fVar210;
        fVar210 = fVar210 * fVar211 * fVar211 * 3.0;
        auVar139._4_4_ = fVar212;
        auVar139._0_4_ = fVar212;
        auVar139._8_4_ = fVar212;
        auVar139._12_4_ = fVar212;
        auVar134._4_4_ = fVar201;
        auVar134._0_4_ = fVar201;
        auVar134._8_4_ = fVar201;
        auVar134._12_4_ = fVar201;
        auVar106._4_4_ = fVar210;
        auVar106._0_4_ = fVar210;
        auVar106._8_4_ = fVar210;
        auVar106._12_4_ = fVar210;
        fVar211 = fVar211 * fVar211 * fVar211;
        auVar165._0_4_ = (float)local_2a0._0_4_ * fVar211;
        auVar165._4_4_ = (float)local_2a0._4_4_ * fVar211;
        auVar165._8_4_ = fStack_298 * fVar211;
        auVar165._12_4_ = fStack_294 * fVar211;
        auVar44 = vfmadd231ps_fma(auVar165,auVar42,auVar106);
        auVar44 = vfmadd231ps_fma(auVar44,auVar46,auVar134);
        auVar44 = vfmadd231ps_fma(auVar44,auVar41,auVar139);
        auVar107._8_8_ = auVar44._0_8_;
        auVar107._0_8_ = auVar44._0_8_;
        auVar44 = vshufpd_avx(auVar44,auVar44,3);
        auVar52 = vshufps_avx(auVar63,auVar63,0x55);
        auVar44 = vsubps_avx(auVar44,auVar107);
        auVar52 = vfmadd213ps_fma(auVar44,auVar52,auVar107);
        fVar212 = auVar52._0_4_;
        auVar44 = vshufps_avx(auVar52,auVar52,0x55);
        auVar108._0_4_ = auVar49._0_4_ * fVar212 + auVar67._0_4_ * auVar44._0_4_;
        auVar108._4_4_ = auVar49._4_4_ * fVar212 + auVar67._4_4_ * auVar44._4_4_;
        auVar108._8_4_ = auVar49._8_4_ * fVar212 + auVar67._8_4_ * auVar44._8_4_;
        auVar108._12_4_ = auVar49._12_4_ * fVar212 + auVar67._12_4_ * auVar44._12_4_;
        auVar63 = vsubps_avx(auVar63,auVar108);
        auVar44 = vandps_avx512vl(auVar52,auVar246._0_16_);
        auVar52 = vprolq_avx512vl(auVar44,0x20);
        auVar44 = vmaxss_avx(auVar52,auVar44);
        bVar38 = auVar44._0_4_ <= (float)local_2b0._0_4_;
      } while ((float)local_2b0._0_4_ <= auVar44._0_4_);
      auVar44 = vucomiss_avx512f(auVar65);
      if (bVar38) {
        auVar49 = vucomiss_avx512f(auVar44);
        auVar249 = ZEXT1664(auVar49);
        if (bVar38) {
          vmovshdup_avx(auVar44);
          auVar49 = vucomiss_avx512f(auVar65);
          if (bVar38) {
            auVar52 = vucomiss_avx512f(auVar49);
            auVar249 = ZEXT1664(auVar52);
            if (bVar38) {
              auVar53 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar64 = vinsertps_avx(auVar53,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar53 = vdpps_avx(auVar64,local_2c0,0x7f);
              auVar57 = vdpps_avx(auVar64,local_2d0,0x7f);
              auVar58 = vdpps_avx(auVar64,local_2e0,0x7f);
              auVar66 = vdpps_avx(auVar64,local_2f0,0x7f);
              auVar70 = vdpps_avx(auVar64,local_300,0x7f);
              auVar61 = vdpps_avx(auVar64,local_310,0x7f);
              auVar62 = vdpps_avx(auVar64,local_320,0x7f);
              auVar64 = vdpps_avx(auVar64,local_330,0x7f);
              auVar63 = vsubss_avx512f(auVar52,auVar49);
              fVar211 = auVar49._0_4_;
              auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar70._0_4_)),auVar63,auVar53);
              auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar211)),auVar63,auVar57);
              auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar211)),auVar63,auVar58);
              auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar64._0_4_)),auVar63,auVar66);
              auVar52 = vsubss_avx512f(auVar52,auVar44);
              auVar172._0_4_ = auVar52._0_4_;
              fVar212 = auVar172._0_4_ * auVar172._0_4_ * auVar172._0_4_;
              local_120 = auVar44._0_4_;
              fVar201 = local_120 * 3.0 * auVar172._0_4_ * auVar172._0_4_;
              fVar210 = auVar172._0_4_ * local_120 * local_120 * 3.0;
              fVar223 = local_120 * local_120 * local_120;
              auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar58._0_4_)),
                                        ZEXT416((uint)fVar210),auVar57);
              auVar52 = vfmadd231ss_fma(auVar52,ZEXT416((uint)fVar201),auVar53);
              auVar49 = vfmadd231ss_fma(auVar52,ZEXT416((uint)fVar212),auVar49);
              fVar213 = auVar49._0_4_;
              if ((fVar103 <= fVar213) &&
                 (fVar224 = *(float *)(ray + k * 4 + 0x100), fVar213 <= fVar224)) {
                auVar49 = vshufps_avx(auVar44,auVar44,0x55);
                auVar53 = vsubps_avx512vl(auVar47,auVar49);
                fVar225 = auVar49._0_4_;
                auVar199._0_4_ = fVar225 * (float)local_350._0_4_;
                fVar226 = auVar49._4_4_;
                auVar199._4_4_ = fVar226 * (float)local_350._4_4_;
                fVar231 = auVar49._8_4_;
                auVar199._8_4_ = fVar231 * fStack_348;
                fVar232 = auVar49._12_4_;
                auVar199._12_4_ = fVar232 * fStack_344;
                auVar209._0_4_ = fVar225 * (float)local_3a0._0_4_;
                auVar209._4_4_ = fVar226 * (float)local_3a0._4_4_;
                auVar209._8_4_ = fVar231 * fStack_398;
                auVar209._12_4_ = fVar232 * fStack_394;
                auVar221._0_4_ = fVar225 * (float)local_3b0._0_4_;
                auVar221._4_4_ = fVar226 * (float)local_3b0._4_4_;
                auVar221._8_4_ = fVar231 * fStack_3a8;
                auVar221._12_4_ = fVar232 * fStack_3a4;
                auVar182._0_4_ = fVar225 * (float)local_370._0_4_;
                auVar182._4_4_ = fVar226 * (float)local_370._4_4_;
                auVar182._8_4_ = fVar231 * fStack_368;
                auVar182._12_4_ = fVar232 * fStack_364;
                auVar49 = vfmadd231ps_fma(auVar199,auVar53,local_340);
                auVar47 = vfmadd231ps_fma(auVar209,auVar53,local_380);
                auVar52 = vfmadd231ps_fma(auVar221,auVar53,local_390);
                auVar53 = vfmadd231ps_fma(auVar182,auVar53,local_360);
                auVar49 = vsubps_avx(auVar47,auVar49);
                auVar47 = vsubps_avx(auVar52,auVar47);
                auVar52 = vsubps_avx(auVar53,auVar52);
                auVar222._0_4_ = local_120 * auVar47._0_4_;
                auVar222._4_4_ = local_120 * auVar47._4_4_;
                auVar222._8_4_ = local_120 * auVar47._8_4_;
                auVar222._12_4_ = local_120 * auVar47._12_4_;
                auVar172._4_4_ = auVar172._0_4_;
                auVar172._8_4_ = auVar172._0_4_;
                auVar172._12_4_ = auVar172._0_4_;
                auVar49 = vfmadd231ps_fma(auVar222,auVar172,auVar49);
                auVar183._0_4_ = local_120 * auVar52._0_4_;
                auVar183._4_4_ = local_120 * auVar52._4_4_;
                auVar183._8_4_ = local_120 * auVar52._8_4_;
                auVar183._12_4_ = local_120 * auVar52._12_4_;
                auVar47 = vfmadd231ps_fma(auVar183,auVar172,auVar47);
                auVar184._0_4_ = local_120 * auVar47._0_4_;
                auVar184._4_4_ = local_120 * auVar47._4_4_;
                auVar184._8_4_ = local_120 * auVar47._8_4_;
                auVar184._12_4_ = local_120 * auVar47._12_4_;
                auVar49 = vfmadd231ps_fma(auVar184,auVar172,auVar49);
                auVar16._8_4_ = 0x40400000;
                auVar16._0_8_ = 0x4040000040400000;
                auVar16._12_4_ = 0x40400000;
                auVar49 = vmulps_avx512vl(auVar49,auVar16);
                pGVar6 = (context->scene->geometries).items[uVar3].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar166._0_4_ = fVar223 * (float)local_3f0._0_4_;
                  auVar166._4_4_ = fVar223 * (float)local_3f0._4_4_;
                  auVar166._8_4_ = fVar223 * fStack_3e8;
                  auVar166._12_4_ = fVar223 * fStack_3e4;
                  auVar153._4_4_ = fVar210;
                  auVar153._0_4_ = fVar210;
                  auVar153._8_4_ = fVar210;
                  auVar153._12_4_ = fVar210;
                  auVar47 = vfmadd132ps_fma(auVar153,auVar166,local_3e0);
                  auVar140._4_4_ = fVar201;
                  auVar140._0_4_ = fVar201;
                  auVar140._8_4_ = fVar201;
                  auVar140._12_4_ = fVar201;
                  auVar47 = vfmadd132ps_fma(auVar140,auVar47,local_3d0);
                  auVar135._4_4_ = fVar212;
                  auVar135._0_4_ = fVar212;
                  auVar135._8_4_ = fVar212;
                  auVar135._12_4_ = fVar212;
                  auVar53 = vfmadd132ps_fma(auVar135,auVar47,local_3c0);
                  auVar47 = vshufps_avx(auVar53,auVar53,0xc9);
                  auVar52 = vshufps_avx(auVar49,auVar49,0xc9);
                  auVar136._0_4_ = auVar53._0_4_ * auVar52._0_4_;
                  auVar136._4_4_ = auVar53._4_4_ * auVar52._4_4_;
                  auVar136._8_4_ = auVar53._8_4_ * auVar52._8_4_;
                  auVar136._12_4_ = auVar53._12_4_ * auVar52._12_4_;
                  auVar49 = vfmsub231ps_fma(auVar136,auVar49,auVar47);
                  local_140 = auVar49._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar213;
                    uVar109 = vextractps_avx(auVar49,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar109;
                    uVar109 = vextractps_avx(auVar49,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar109;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar211;
                    *(uint *)(ray + k * 4 + 0x220) = uVar4;
                    *(uint *)(ray + k * 4 + 0x240) = uVar3;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_01815cac;
                  }
                  auVar141._8_4_ = 1;
                  auVar141._0_8_ = 0x100000001;
                  auVar141._12_4_ = 1;
                  auVar141._16_4_ = 1;
                  auVar141._20_4_ = 1;
                  auVar141._24_4_ = 1;
                  auVar141._28_4_ = 1;
                  local_100 = vpermps_avx2(auVar141,ZEXT1632(auVar44));
                  auVar88 = vpermps_avx2(auVar141,ZEXT1632(auVar49));
                  auVar154._8_4_ = 2;
                  auVar154._0_8_ = 0x200000002;
                  auVar154._12_4_ = 2;
                  auVar154._16_4_ = 2;
                  auVar154._20_4_ = 2;
                  auVar154._24_4_ = 2;
                  auVar154._28_4_ = 2;
                  local_160 = vpermps_avx2(auVar154,ZEXT1632(auVar49));
                  local_180[0] = (RTCHitN)auVar88[0];
                  local_180[1] = (RTCHitN)auVar88[1];
                  local_180[2] = (RTCHitN)auVar88[2];
                  local_180[3] = (RTCHitN)auVar88[3];
                  local_180[4] = (RTCHitN)auVar88[4];
                  local_180[5] = (RTCHitN)auVar88[5];
                  local_180[6] = (RTCHitN)auVar88[6];
                  local_180[7] = (RTCHitN)auVar88[7];
                  local_180[8] = (RTCHitN)auVar88[8];
                  local_180[9] = (RTCHitN)auVar88[9];
                  local_180[10] = (RTCHitN)auVar88[10];
                  local_180[0xb] = (RTCHitN)auVar88[0xb];
                  local_180[0xc] = (RTCHitN)auVar88[0xc];
                  local_180[0xd] = (RTCHitN)auVar88[0xd];
                  local_180[0xe] = (RTCHitN)auVar88[0xe];
                  local_180[0xf] = (RTCHitN)auVar88[0xf];
                  local_180[0x10] = (RTCHitN)auVar88[0x10];
                  local_180[0x11] = (RTCHitN)auVar88[0x11];
                  local_180[0x12] = (RTCHitN)auVar88[0x12];
                  local_180[0x13] = (RTCHitN)auVar88[0x13];
                  local_180[0x14] = (RTCHitN)auVar88[0x14];
                  local_180[0x15] = (RTCHitN)auVar88[0x15];
                  local_180[0x16] = (RTCHitN)auVar88[0x16];
                  local_180[0x17] = (RTCHitN)auVar88[0x17];
                  local_180[0x18] = (RTCHitN)auVar88[0x18];
                  local_180[0x19] = (RTCHitN)auVar88[0x19];
                  local_180[0x1a] = (RTCHitN)auVar88[0x1a];
                  local_180[0x1b] = (RTCHitN)auVar88[0x1b];
                  local_180[0x1c] = (RTCHitN)auVar88[0x1c];
                  local_180[0x1d] = (RTCHitN)auVar88[0x1d];
                  local_180[0x1e] = (RTCHitN)auVar88[0x1e];
                  local_180[0x1f] = (RTCHitN)auVar88[0x1f];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  local_e0 = local_220._0_8_;
                  uStack_d8 = local_220._8_8_;
                  uStack_d0 = local_220._16_8_;
                  uStack_c8 = local_220._24_8_;
                  local_c0 = local_200;
                  vpcmpeqd_avx2(local_200,local_200);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar213;
                  local_420 = local_240;
                  local_460.valid = (int *)local_420;
                  local_460.geometryUserPtr = pGVar6->userPtr;
                  local_460.context = context->user;
                  local_460.hit = local_180;
                  local_460.N = 8;
                  local_460.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar6->intersectionFilterN)(&local_460);
                    auVar44 = vxorps_avx512vl(auVar65,auVar65);
                    auVar248 = ZEXT1664(auVar44);
                    auVar249 = ZEXT464(0x3f800000);
                    auVar245 = ZEXT3264(_DAT_01fb9fe0);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar244 = ZEXT1664(auVar44);
                    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar243 = ZEXT3264(auVar88);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar242 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar250 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar247 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar246 = ZEXT1664(auVar44);
                  }
                  auVar44 = auVar248._0_16_;
                  if (local_420 != (undefined1  [32])0x0) {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var7)(&local_460);
                      auVar44 = vxorps_avx512vl(auVar44,auVar44);
                      auVar248 = ZEXT1664(auVar44);
                      auVar249 = ZEXT464(0x3f800000);
                      auVar245 = ZEXT3264(_DAT_01fb9fe0);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar244 = ZEXT1664(auVar44);
                      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar243 = ZEXT3264(auVar88);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar242 = ZEXT1664(auVar44);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar250 = ZEXT1664(auVar44);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar247 = ZEXT1664(auVar44);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar246 = ZEXT1664(auVar44);
                    }
                    if (local_420 != (undefined1  [32])0x0) {
                      uVar35 = vptestmd_avx512vl(local_420,local_420);
                      iVar20 = *(int *)(local_460.hit + 4);
                      iVar21 = *(int *)(local_460.hit + 8);
                      iVar22 = *(int *)(local_460.hit + 0xc);
                      iVar23 = *(int *)(local_460.hit + 0x10);
                      iVar24 = *(int *)(local_460.hit + 0x14);
                      iVar25 = *(int *)(local_460.hit + 0x18);
                      iVar26 = *(int *)(local_460.hit + 0x1c);
                      bVar27 = (byte)uVar35;
                      bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar39 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar40 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar11 = SUB81(uVar35 >> 7,0);
                      *(uint *)(local_460.ray + 0x180) =
                           (uint)(bVar27 & 1) * *(int *)local_460.hit |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x180);
                      *(uint *)(local_460.ray + 0x184) =
                           (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_460.ray + 0x184);
                      *(uint *)(local_460.ray + 0x188) =
                           (uint)bVar37 * iVar21 | (uint)!bVar37 * *(int *)(local_460.ray + 0x188);
                      *(uint *)(local_460.ray + 0x18c) =
                           (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_460.ray + 0x18c);
                      *(uint *)(local_460.ray + 400) =
                           (uint)bVar39 * iVar23 | (uint)!bVar39 * *(int *)(local_460.ray + 400);
                      *(uint *)(local_460.ray + 0x194) =
                           (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_460.ray + 0x194);
                      *(uint *)(local_460.ray + 0x198) =
                           (uint)bVar10 * iVar25 | (uint)!bVar10 * *(int *)(local_460.ray + 0x198);
                      *(uint *)(local_460.ray + 0x19c) =
                           (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_460.ray + 0x19c);
                      iVar20 = *(int *)(local_460.hit + 0x24);
                      iVar21 = *(int *)(local_460.hit + 0x28);
                      iVar22 = *(int *)(local_460.hit + 0x2c);
                      iVar23 = *(int *)(local_460.hit + 0x30);
                      iVar24 = *(int *)(local_460.hit + 0x34);
                      iVar25 = *(int *)(local_460.hit + 0x38);
                      iVar26 = *(int *)(local_460.hit + 0x3c);
                      bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar39 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar40 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar11 = SUB81(uVar35 >> 7,0);
                      *(uint *)(local_460.ray + 0x1a0) =
                           (uint)(bVar27 & 1) * *(int *)(local_460.hit + 0x20) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x1a0);
                      *(uint *)(local_460.ray + 0x1a4) =
                           (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_460.ray + 0x1a4);
                      *(uint *)(local_460.ray + 0x1a8) =
                           (uint)bVar37 * iVar21 | (uint)!bVar37 * *(int *)(local_460.ray + 0x1a8);
                      *(uint *)(local_460.ray + 0x1ac) =
                           (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_460.ray + 0x1ac);
                      *(uint *)(local_460.ray + 0x1b0) =
                           (uint)bVar39 * iVar23 | (uint)!bVar39 * *(int *)(local_460.ray + 0x1b0);
                      *(uint *)(local_460.ray + 0x1b4) =
                           (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_460.ray + 0x1b4);
                      *(uint *)(local_460.ray + 0x1b8) =
                           (uint)bVar10 * iVar25 | (uint)!bVar10 * *(int *)(local_460.ray + 0x1b8);
                      *(uint *)(local_460.ray + 0x1bc) =
                           (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_460.ray + 0x1bc);
                      iVar20 = *(int *)(local_460.hit + 0x44);
                      iVar21 = *(int *)(local_460.hit + 0x48);
                      iVar22 = *(int *)(local_460.hit + 0x4c);
                      iVar23 = *(int *)(local_460.hit + 0x50);
                      iVar24 = *(int *)(local_460.hit + 0x54);
                      iVar25 = *(int *)(local_460.hit + 0x58);
                      iVar26 = *(int *)(local_460.hit + 0x5c);
                      bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar39 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar40 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar11 = SUB81(uVar35 >> 7,0);
                      *(uint *)(local_460.ray + 0x1c0) =
                           (uint)(bVar27 & 1) * *(int *)(local_460.hit + 0x40) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x1c0);
                      *(uint *)(local_460.ray + 0x1c4) =
                           (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_460.ray + 0x1c4);
                      *(uint *)(local_460.ray + 0x1c8) =
                           (uint)bVar37 * iVar21 | (uint)!bVar37 * *(int *)(local_460.ray + 0x1c8);
                      *(uint *)(local_460.ray + 0x1cc) =
                           (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_460.ray + 0x1cc);
                      *(uint *)(local_460.ray + 0x1d0) =
                           (uint)bVar39 * iVar23 | (uint)!bVar39 * *(int *)(local_460.ray + 0x1d0);
                      *(uint *)(local_460.ray + 0x1d4) =
                           (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_460.ray + 0x1d4);
                      *(uint *)(local_460.ray + 0x1d8) =
                           (uint)bVar10 * iVar25 | (uint)!bVar10 * *(int *)(local_460.ray + 0x1d8);
                      *(uint *)(local_460.ray + 0x1dc) =
                           (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_460.ray + 0x1dc);
                      iVar20 = *(int *)(local_460.hit + 100);
                      iVar21 = *(int *)(local_460.hit + 0x68);
                      iVar22 = *(int *)(local_460.hit + 0x6c);
                      iVar23 = *(int *)(local_460.hit + 0x70);
                      iVar24 = *(int *)(local_460.hit + 0x74);
                      iVar25 = *(int *)(local_460.hit + 0x78);
                      iVar26 = *(int *)(local_460.hit + 0x7c);
                      bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar39 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar40 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar11 = SUB81(uVar35 >> 7,0);
                      *(uint *)(local_460.ray + 0x1e0) =
                           (uint)(bVar27 & 1) * *(int *)(local_460.hit + 0x60) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x1e0);
                      *(uint *)(local_460.ray + 0x1e4) =
                           (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_460.ray + 0x1e4);
                      *(uint *)(local_460.ray + 0x1e8) =
                           (uint)bVar37 * iVar21 | (uint)!bVar37 * *(int *)(local_460.ray + 0x1e8);
                      *(uint *)(local_460.ray + 0x1ec) =
                           (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_460.ray + 0x1ec);
                      *(uint *)(local_460.ray + 0x1f0) =
                           (uint)bVar39 * iVar23 | (uint)!bVar39 * *(int *)(local_460.ray + 0x1f0);
                      *(uint *)(local_460.ray + 500) =
                           (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_460.ray + 500);
                      *(uint *)(local_460.ray + 0x1f8) =
                           (uint)bVar10 * iVar25 | (uint)!bVar10 * *(int *)(local_460.ray + 0x1f8);
                      *(uint *)(local_460.ray + 0x1fc) =
                           (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_460.ray + 0x1fc);
                      iVar20 = *(int *)(local_460.hit + 0x84);
                      iVar21 = *(int *)(local_460.hit + 0x88);
                      iVar22 = *(int *)(local_460.hit + 0x8c);
                      iVar23 = *(int *)(local_460.hit + 0x90);
                      iVar24 = *(int *)(local_460.hit + 0x94);
                      iVar25 = *(int *)(local_460.hit + 0x98);
                      iVar26 = *(int *)(local_460.hit + 0x9c);
                      bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar39 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar40 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar11 = SUB81(uVar35 >> 7,0);
                      *(uint *)(local_460.ray + 0x200) =
                           (uint)(bVar27 & 1) * *(int *)(local_460.hit + 0x80) |
                           (uint)!(bool)(bVar27 & 1) * *(int *)(local_460.ray + 0x200);
                      *(uint *)(local_460.ray + 0x204) =
                           (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_460.ray + 0x204);
                      *(uint *)(local_460.ray + 0x208) =
                           (uint)bVar37 * iVar21 | (uint)!bVar37 * *(int *)(local_460.ray + 0x208);
                      *(uint *)(local_460.ray + 0x20c) =
                           (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_460.ray + 0x20c);
                      *(uint *)(local_460.ray + 0x210) =
                           (uint)bVar39 * iVar23 | (uint)!bVar39 * *(int *)(local_460.ray + 0x210);
                      *(uint *)(local_460.ray + 0x214) =
                           (uint)bVar40 * iVar24 | (uint)!bVar40 * *(int *)(local_460.ray + 0x214);
                      *(uint *)(local_460.ray + 0x218) =
                           (uint)bVar10 * iVar25 | (uint)!bVar10 * *(int *)(local_460.ray + 0x218);
                      *(uint *)(local_460.ray + 0x21c) =
                           (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_460.ray + 0x21c);
                      auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xa0));
                      *(undefined1 (*) [32])(local_460.ray + 0x220) = auVar88;
                      auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xc0));
                      *(undefined1 (*) [32])(local_460.ray + 0x240) = auVar88;
                      auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xe0));
                      *(undefined1 (*) [32])(local_460.ray + 0x260) = auVar88;
                      auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0x100));
                      *(undefined1 (*) [32])(local_460.ray + 0x280) = auVar88;
                      goto LAB_01815cac;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar224;
                }
              }
            }
          }
        }
      }
      goto LAB_01815cac;
    }
    auVar67 = vinsertps_avx(auVar145,auVar59,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }